

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx2::SubGridMBIntersectorKPluecker<4,_8,_true>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  BBox1f BVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  Geometry *pGVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  uint uVar58;
  int iVar59;
  AABBNodeMB4D *node1;
  ulong uVar60;
  long lVar61;
  uint uVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  ulong uVar67;
  ulong uVar68;
  NodeRef root;
  size_t sVar69;
  ulong uVar70;
  ulong uVar71;
  ulong *puVar72;
  undefined1 (*pauVar73) [32];
  RayK<8> *pRVar74;
  undefined4 uVar75;
  ulong unaff_R14;
  long lVar76;
  RayQueryContext *pRVar77;
  bool bVar78;
  undefined1 auVar83 [16];
  float fVar79;
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar80 [16];
  undefined1 auVar87 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  float fVar94;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar97 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  float fVar109;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar107;
  float fVar108;
  float fVar110;
  float fVar111;
  float fVar112;
  undefined1 in_ZMM1 [64];
  undefined1 auVar106 [64];
  undefined1 auVar113 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar114 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [64];
  undefined1 auVar129 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar130 [16];
  undefined1 auVar139 [32];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [64];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar146 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar159 [16];
  undefined1 auVar168 [32];
  undefined1 auVar160 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar175 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar195 [16];
  float fVar194;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar207 [16];
  float fVar206;
  float fVar213;
  float fVar214;
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  float fVar215;
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  float fVar219;
  undefined1 auVar220 [32];
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  undefined1 in_ZMM13 [64];
  undefined1 in_ZMM14 [64];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  undefined1 in_ZMM15 [64];
  Precalculations pre;
  UVIdentity<8> mapUV;
  float old_t;
  vbool<8> terminated;
  RTCFilterFunctionNArguments args;
  vbool<8> valid0;
  TravRayK<8,_true> tray;
  vint<8> itime;
  vfloat<8> ftime;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  Precalculations local_2f3a;
  undefined1 local_2f39;
  size_t local_2f38;
  ulong local_2f30;
  undefined1 (*local_2f28) [32];
  ulong *local_2f20;
  uint local_2f14;
  uint local_2f10;
  uint local_2f0c;
  RayK<8> *local_2f08;
  undefined1 local_2f00 [32];
  undefined1 local_2ee0 [32];
  undefined1 local_2ec0 [8];
  float fStack_2eb8;
  float fStack_2eb4;
  float fStack_2eb0;
  float fStack_2eac;
  float fStack_2ea8;
  float fStack_2ea4;
  undefined1 local_2ea0 [32];
  BVH *local_2e70;
  Intersectors *local_2e68;
  long local_2e60;
  long local_2e58;
  long local_2e50;
  ulong local_2e48;
  RayK<8> *local_2e40;
  RayQueryContext *local_2e38;
  ulong local_2e30;
  ulong local_2e28;
  ulong local_2e20;
  long local_2e18;
  long local_2e10;
  Scene *local_2e08;
  undefined1 local_2e00 [32];
  undefined1 local_2de0 [32];
  undefined1 local_2dc0 [32];
  RTCFilterFunctionNArguments local_2d90;
  undefined1 local_2d60 [32];
  undefined1 local_2d40 [32];
  undefined1 local_2d20 [32];
  undefined1 local_2d00 [32];
  undefined1 local_2ce0 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2cc0;
  undefined1 local_2c60 [32];
  undefined1 local_2c40 [32];
  undefined1 local_2c20 [32];
  undefined1 local_2c00 [32];
  undefined1 local_2be0 [8];
  float fStack_2bd8;
  float fStack_2bd4;
  float fStack_2bd0;
  float fStack_2bcc;
  float fStack_2bc8;
  undefined1 local_2bc0 [8];
  float fStack_2bb8;
  float fStack_2bb4;
  float fStack_2bb0;
  float fStack_2bac;
  float fStack_2ba8;
  undefined1 local_2ba0 [32];
  undefined1 local_2b80 [32];
  undefined1 local_2b60 [32];
  undefined1 local_2b40 [32];
  undefined1 local_2b20 [32];
  undefined1 local_2b00 [32];
  undefined1 local_2ae0 [32];
  undefined1 local_2ac0 [32];
  undefined1 *local_2aa0;
  undefined1 local_2a80 [32];
  undefined1 local_2a60 [32];
  undefined1 local_2a40 [32];
  undefined1 local_2a20 [32];
  undefined1 local_2a00 [32];
  float local_29e0 [4];
  float fStack_29d0;
  float fStack_29cc;
  float fStack_29c8;
  undefined4 uStack_29c4;
  float local_29c0 [4];
  float fStack_29b0;
  float fStack_29ac;
  float fStack_29a8;
  undefined4 uStack_29a4;
  RTCHitN local_29a0 [32];
  undefined1 local_2980 [32];
  undefined1 local_2960 [32];
  undefined4 local_2940;
  undefined4 uStack_293c;
  undefined4 uStack_2938;
  undefined4 uStack_2934;
  undefined4 uStack_2930;
  undefined4 uStack_292c;
  undefined4 uStack_2928;
  undefined4 uStack_2924;
  undefined4 local_2920;
  undefined4 uStack_291c;
  undefined4 uStack_2918;
  undefined4 uStack_2914;
  undefined4 uStack_2910;
  undefined4 uStack_290c;
  undefined4 uStack_2908;
  undefined4 uStack_2904;
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [8];
  float fStack_2858;
  float fStack_2854;
  float fStack_2850;
  float fStack_284c;
  float fStack_2848;
  undefined1 local_2840 [8];
  float fStack_2838;
  float fStack_2834;
  float fStack_2830;
  float fStack_282c;
  float fStack_2828;
  undefined1 local_2820 [32];
  uint local_2800;
  uint uStack_27fc;
  uint uStack_27f8;
  uint uStack_27f4;
  uint uStack_27f0;
  uint uStack_27ec;
  uint uStack_27e8;
  uint uStack_27e4;
  uint local_27e0;
  uint uStack_27dc;
  uint uStack_27d8;
  uint uStack_27d4;
  uint uStack_27d0;
  uint uStack_27cc;
  uint uStack_27c8;
  uint uStack_27c4;
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined4 local_1e80;
  undefined4 uStack_1e7c;
  undefined4 uStack_1e78;
  undefined4 uStack_1e74;
  undefined4 uStack_1e70;
  undefined4 uStack_1e6c;
  undefined4 uStack_1e68;
  undefined4 uStack_1e64;
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  undefined1 auVar124 [32];
  
  local_2e70 = (BVH *)This->ptr;
  local_2608 = (local_2e70->root).ptr;
  if (local_2608 != 8) {
    auVar135 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    auVar80 = ZEXT816(0) << 0x40;
    auVar85 = vpcmpeqd_avx2(auVar135,(undefined1  [32])valid_i->field_0);
    auVar135 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar80),5);
    auVar116 = auVar85 & auVar135;
    if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar116 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar116 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar116 >> 0x7f,0) != '\0') ||
          (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar116 >> 0xbf,0) != '\0') ||
        (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar116[0x1f] < '\0') {
      auVar135 = vandps_avx(auVar135,auVar85);
      auVar95 = vpackssdw_avx(auVar135._0_16_,auVar135._16_16_);
      local_2cc0._0_8_ = *(undefined8 *)ray;
      local_2cc0._8_8_ = *(undefined8 *)(ray + 8);
      local_2cc0._16_8_ = *(undefined8 *)(ray + 0x10);
      local_2cc0._24_8_ = *(undefined8 *)(ray + 0x18);
      local_2cc0._32_8_ = *(undefined8 *)(ray + 0x20);
      local_2cc0._40_8_ = *(undefined8 *)(ray + 0x28);
      local_2cc0._48_8_ = *(undefined8 *)(ray + 0x30);
      local_2cc0._56_8_ = *(undefined8 *)(ray + 0x38);
      local_2cc0._64_8_ = *(undefined8 *)(ray + 0x40);
      local_2cc0._72_8_ = *(undefined8 *)(ray + 0x48);
      local_2cc0._80_8_ = *(undefined8 *)(ray + 0x50);
      local_2cc0._88_8_ = *(undefined8 *)(ray + 0x58);
      local_2c60 = *(undefined1 (*) [32])(ray + 0x80);
      local_2c40 = *(undefined1 (*) [32])(ray + 0xa0);
      local_2c20 = *(undefined1 (*) [32])(ray + 0xc0);
      local_2d00._8_4_ = 0x7fffffff;
      local_2d00._0_8_ = 0x7fffffff7fffffff;
      local_2d00._12_4_ = 0x7fffffff;
      local_2d00._16_4_ = 0x7fffffff;
      local_2d00._20_4_ = 0x7fffffff;
      local_2d00._24_4_ = 0x7fffffff;
      local_2d00._28_4_ = 0x7fffffff;
      auVar142._8_4_ = 0x219392ef;
      auVar142._0_8_ = 0x219392ef219392ef;
      auVar142._12_4_ = 0x219392ef;
      auVar142._16_4_ = 0x219392ef;
      auVar142._20_4_ = 0x219392ef;
      auVar142._24_4_ = 0x219392ef;
      auVar142._28_4_ = 0x219392ef;
      auVar216._8_4_ = 0x3f800000;
      auVar216._0_8_ = 0x3f8000003f800000;
      auVar216._12_4_ = 0x3f800000;
      auVar216._16_4_ = 0x3f800000;
      auVar216._20_4_ = 0x3f800000;
      auVar216._24_4_ = 0x3f800000;
      auVar216._28_4_ = 0x3f800000;
      auVar133 = vdivps_avx(auVar216,local_2c60);
      auVar135 = vandps_avx(local_2d00,local_2c60);
      auVar116 = vcmpps_avx(auVar135,auVar142,1);
      auVar135 = vandps_avx(local_2d00,local_2c40);
      auVar85 = vcmpps_avx(auVar135,auVar142,1);
      auVar134 = vdivps_avx(auVar216,local_2c40);
      auVar135 = vandps_avx(local_2d00,local_2c20);
      auVar135 = vcmpps_avx(auVar135,auVar142,1);
      auVar147 = vdivps_avx(auVar216,local_2c20);
      auVar208._8_4_ = 0x5d5e0b6b;
      auVar208._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar208._12_4_ = 0x5d5e0b6b;
      auVar208._16_4_ = 0x5d5e0b6b;
      auVar208._20_4_ = 0x5d5e0b6b;
      auVar208._24_4_ = 0x5d5e0b6b;
      auVar208._28_4_ = 0x5d5e0b6b;
      local_2c00 = vblendvps_avx(auVar133,auVar208,auVar116);
      _local_2be0 = vblendvps_avx(auVar134,auVar208,auVar85);
      _local_2bc0 = vblendvps_avx(auVar147,auVar208,auVar135);
      auVar135 = vcmpps_avx(local_2c00,ZEXT1632(auVar80),1);
      auVar116._8_4_ = 0x10;
      auVar116._0_8_ = 0x1000000010;
      auVar116._12_4_ = 0x10;
      auVar116._16_4_ = 0x10;
      auVar116._20_4_ = 0x10;
      auVar116._24_4_ = 0x10;
      auVar116._28_4_ = 0x10;
      local_2ba0 = vandps_avx(auVar135,auVar116);
      auVar133._8_4_ = 0x20;
      auVar133._0_8_ = 0x2000000020;
      auVar133._12_4_ = 0x20;
      auVar133._16_4_ = 0x20;
      auVar133._20_4_ = 0x20;
      auVar133._24_4_ = 0x20;
      auVar133._28_4_ = 0x20;
      auVar176._8_4_ = 0x30;
      auVar176._0_8_ = 0x3000000030;
      auVar176._12_4_ = 0x30;
      auVar176._16_4_ = 0x30;
      auVar176._20_4_ = 0x30;
      auVar176._24_4_ = 0x30;
      auVar176._28_4_ = 0x30;
      auVar116 = ZEXT1632(auVar80);
      auVar135 = vcmpps_avx(_local_2be0,auVar116,5);
      local_2b80 = vblendvps_avx(auVar176,auVar133,auVar135);
      auVar134._8_4_ = 0x40;
      auVar134._0_8_ = 0x4000000040;
      auVar134._12_4_ = 0x40;
      auVar134._16_4_ = 0x40;
      auVar134._20_4_ = 0x40;
      auVar134._24_4_ = 0x40;
      auVar134._28_4_ = 0x40;
      auVar147._8_4_ = 0x50;
      auVar147._0_8_ = 0x5000000050;
      auVar147._12_4_ = 0x50;
      auVar147._16_4_ = 0x50;
      auVar147._20_4_ = 0x50;
      auVar147._24_4_ = 0x50;
      auVar147._28_4_ = 0x50;
      auVar135 = vcmpps_avx(_local_2bc0,auVar116,5);
      local_2b60 = vblendvps_avx(auVar147,auVar134,auVar135);
      auVar135 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar116);
      auVar116 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar116);
      local_2880 = vpmovsxwd_avx2(auVar95);
      auVar85._8_4_ = 0x7f800000;
      auVar85._0_8_ = 0x7f8000007f800000;
      auVar85._12_4_ = 0x7f800000;
      auVar85._16_4_ = 0x7f800000;
      auVar85._20_4_ = 0x7f800000;
      auVar85._24_4_ = 0x7f800000;
      auVar85._28_4_ = 0x7f800000;
      local_2b40 = vblendvps_avx(auVar85,auVar135,local_2880);
      auVar135._8_4_ = 0xff800000;
      auVar135._0_8_ = 0xff800000ff800000;
      auVar135._12_4_ = 0xff800000;
      auVar135._16_4_ = 0xff800000;
      auVar135._20_4_ = 0xff800000;
      auVar135._24_4_ = 0xff800000;
      auVar135._28_4_ = 0xff800000;
      local_2b20 = vblendvps_avx(auVar135,auVar116,local_2880);
      auVar80 = vpcmpeqd_avx(local_2b20._0_16_,local_2b20._0_16_);
      local_2e00 = vpmovsxwd_avx2(auVar95 ^ auVar80);
      if (context->user == (RTCRayQueryContext *)0x0) {
        local_2f30 = 5;
      }
      else {
        local_2f30 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                            RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
      }
      local_2f08 = ray + 0x100;
      puVar72 = local_2600;
      local_2610 = 0xfffffffffffffff8;
      pauVar73 = (undefined1 (*) [32])local_1e40;
      local_1e80 = 0x7f800000;
      uStack_1e7c = 0x7f800000;
      uStack_1e78 = 0x7f800000;
      uStack_1e74 = 0x7f800000;
      uStack_1e70 = 0x7f800000;
      uStack_1e6c = 0x7f800000;
      uStack_1e68 = 0x7f800000;
      uStack_1e64 = 0x7f800000;
      local_2780._16_16_ = mm_lookupmask_ps._240_16_;
      local_2780._0_16_ = mm_lookupmask_ps._0_16_;
      auVar128 = ZEXT3264(local_2780);
      local_1e60 = local_2b40;
      auVar86._8_4_ = 0xbf800000;
      auVar86._0_8_ = 0xbf800000bf800000;
      auVar86._12_4_ = 0xbf800000;
      auVar86._16_4_ = 0xbf800000;
      auVar86._20_4_ = 0xbf800000;
      auVar86._24_4_ = 0xbf800000;
      auVar86._28_4_ = 0xbf800000;
      auVar98._8_4_ = 0x3f800000;
      auVar98._0_8_ = 0x3f8000003f800000;
      auVar98._12_4_ = 0x3f800000;
      auVar98._16_4_ = 0x3f800000;
      auVar98._20_4_ = 0x3f800000;
      auVar98._24_4_ = 0x3f800000;
      auVar98._28_4_ = 0x3f800000;
      local_27a0 = vblendvps_avx(auVar98,auVar86,local_2780);
      auVar135 = vpcmpeqd_avx2(auVar98,auVar98);
      auVar106 = ZEXT3264(auVar135);
      local_2e68 = This;
      local_2e40 = ray;
      local_2e38 = context;
LAB_00552e1a:
      do {
        do {
          root.ptr = puVar72[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_00554343;
          puVar72 = puVar72 + -1;
          pauVar73 = pauVar73 + -1;
          auVar135 = *pauVar73;
          auVar143 = ZEXT3264(auVar135);
          auVar116 = vcmpps_avx(auVar135,local_2b20,1);
        } while ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                      (auVar116 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar116 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    SUB321(auVar116 >> 0x7f,0) == '\0') &&
                   (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  SUB321(auVar116 >> 0xbf,0) == '\0') &&
                 (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 -1 < auVar116[0x1f]);
        uVar75 = vmovmskps_avx(auVar116);
        unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),uVar75);
        auVar116 = local_2d40;
        if (local_2f30 < (uint)POPCOUNT(uVar75)) {
LAB_00552e5a:
          do {
            uVar62 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00554343;
              auVar135 = vcmpps_avx(local_2b20,auVar143._0_32_,6);
              if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar135 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar135 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar135 >> 0x7f,0) != '\0') ||
                    (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar135 >> 0xbf,0) != '\0') ||
                  (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar135[0x1f] < '\0') {
                local_2e60 = (ulong)(uVar62 & 0xf) - 8;
                if (local_2e60 == 0) {
                  auVar135 = vpcmpeqd_avx2(auVar128._0_32_,auVar128._0_32_);
                  auVar104 = local_2e00;
                }
                else {
                  uVar60 = root.ptr & 0xfffffffffffffff0;
                  auVar106 = ZEXT3264(CONCAT428(local_2e00._28_4_ ^ auVar106._28_4_,
                                                CONCAT424(local_2e00._24_4_ ^ auVar106._24_4_,
                                                          CONCAT420(local_2e00._20_4_ ^
                                                                    auVar106._20_4_,
                                                                    CONCAT416(local_2e00._16_4_ ^
                                                                              auVar106._16_4_,
                                                                              CONCAT412(local_2e00.
                                                                                        _12_4_ ^ 
                                                  auVar106._12_4_,
                                                  CONCAT48(local_2e00._8_4_ ^ auVar106._8_4_,
                                                           CONCAT44(local_2e00._4_4_ ^
                                                                    auVar106._4_4_,
                                                                    local_2e00._0_4_ ^
                                                                    auVar106._0_4_))))))));
                  lVar64 = 0;
                  local_2f28 = pauVar73;
                  local_2f20 = puVar72;
                  do {
                    lVar61 = lVar64 * 0x90;
                    auVar80._8_8_ = 0;
                    auVar80._0_8_ = *(ulong *)(uVar60 + 0x20 + lVar61);
                    auVar95._8_8_ = 0;
                    auVar95._0_8_ = *(ulong *)(uVar60 + 0x24 + lVar61);
                    auVar95 = vpminub_avx(auVar80,auVar95);
                    auVar80 = vpcmpeqb_avx(auVar80,auVar95);
                    auVar95 = vpcmpeqd_avx(auVar95,auVar95);
                    auVar80 = vpmovzxbd_avx(auVar80 ^ auVar95);
                    auVar80 = vpslld_avx(auVar80 ^ auVar95,0x1f);
                    uVar62 = vmovmskps_avx(auVar80);
                    local_2e58 = lVar64;
                    if (uVar62 != 0) {
                      lVar64 = lVar61 + uVar60;
                      uVar75 = *(undefined4 *)(uVar60 + 0x80 + lVar61);
                      auVar87._4_4_ = uVar75;
                      auVar87._0_4_ = uVar75;
                      auVar87._8_4_ = uVar75;
                      auVar87._12_4_ = uVar75;
                      auVar87._16_4_ = uVar75;
                      auVar87._20_4_ = uVar75;
                      auVar87._24_4_ = uVar75;
                      auVar87._28_4_ = uVar75;
                      auVar135 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar87);
                      fVar79 = *(float *)(uVar60 + 0x84 + lVar61);
                      auVar143._0_4_ = fVar79 * auVar135._0_4_;
                      auVar143._4_4_ = fVar79 * auVar135._4_4_;
                      auVar143._8_4_ = fVar79 * auVar135._8_4_;
                      auVar143._12_4_ = fVar79 * auVar135._12_4_;
                      auVar143._16_4_ = fVar79 * auVar135._16_4_;
                      auVar143._20_4_ = fVar79 * auVar135._20_4_;
                      auVar143._28_36_ = in_ZMM13._28_36_;
                      auVar143._24_4_ = fVar79 * auVar135._24_4_;
                      in_ZMM13 = ZEXT3264(auVar143._0_32_);
                      uVar70 = (ulong)(uVar62 & 0xff);
                      local_2820 = auVar143._0_32_;
                      local_2e50 = lVar64;
                      do {
                        auVar135 = auVar106._0_32_;
                        lVar61 = 0;
                        for (uVar67 = uVar70; (uVar67 & 1) == 0;
                            uVar67 = uVar67 >> 1 | 0x8000000000000000) {
                          lVar61 = lVar61 + 1;
                        }
                        auVar81._8_8_ = 0;
                        auVar81._0_8_ = *(ulong *)(lVar64 + 0x20);
                        auVar80 = vpmovzxbd_avx(auVar81);
                        auVar80 = vcvtdq2ps_avx(auVar80);
                        uVar75 = *(undefined4 *)(lVar64 + 0x44);
                        auVar96._4_4_ = uVar75;
                        auVar96._0_4_ = uVar75;
                        auVar96._8_4_ = uVar75;
                        auVar96._12_4_ = uVar75;
                        uVar75 = *(undefined4 *)(lVar64 + 0x38);
                        auVar113._4_4_ = uVar75;
                        auVar113._0_4_ = uVar75;
                        auVar113._8_4_ = uVar75;
                        auVar113._12_4_ = uVar75;
                        auVar80 = vfmadd213ps_fma(auVar80,auVar96,auVar113);
                        local_2b00._0_16_ = auVar80;
                        uVar62 = (int)lVar61 * 4;
                        fVar79 = *(float *)(local_2b00 + uVar62);
                        auVar138._4_4_ = fVar79;
                        auVar138._0_4_ = fVar79;
                        auVar138._8_4_ = fVar79;
                        auVar138._12_4_ = fVar79;
                        auVar138._16_4_ = fVar79;
                        auVar138._20_4_ = fVar79;
                        auVar138._24_4_ = fVar79;
                        auVar138._28_4_ = fVar79;
                        auVar82._8_8_ = 0;
                        auVar82._0_8_ = *(ulong *)(lVar64 + 0x50);
                        auVar80 = vpmovzxbd_avx(auVar82);
                        auVar80 = vcvtdq2ps_avx(auVar80);
                        uVar75 = *(undefined4 *)(lVar64 + 0x74);
                        auVar144._4_4_ = uVar75;
                        auVar144._0_4_ = uVar75;
                        auVar144._8_4_ = uVar75;
                        auVar144._12_4_ = uVar75;
                        uVar75 = *(undefined4 *)(lVar64 + 0x68);
                        auVar157._4_4_ = uVar75;
                        auVar157._0_4_ = uVar75;
                        auVar157._8_4_ = uVar75;
                        auVar157._12_4_ = uVar75;
                        auVar80 = vfmadd213ps_fma(auVar80,auVar144,auVar157);
                        local_29a0[0] = (RTCHitN)auVar80[0];
                        local_29a0[1] = (RTCHitN)auVar80[1];
                        local_29a0[2] = (RTCHitN)auVar80[2];
                        local_29a0[3] = (RTCHitN)auVar80[3];
                        local_29a0[4] = (RTCHitN)auVar80[4];
                        local_29a0[5] = (RTCHitN)auVar80[5];
                        local_29a0[6] = (RTCHitN)auVar80[6];
                        local_29a0[7] = (RTCHitN)auVar80[7];
                        local_29a0[8] = (RTCHitN)auVar80[8];
                        local_29a0[9] = (RTCHitN)auVar80[9];
                        local_29a0[10] = (RTCHitN)auVar80[10];
                        local_29a0[0xb] = (RTCHitN)auVar80[0xb];
                        local_29a0[0xc] = (RTCHitN)auVar80[0xc];
                        local_29a0[0xd] = (RTCHitN)auVar80[0xd];
                        local_29a0[0xe] = (RTCHitN)auVar80[0xe];
                        local_29a0[0xf] = (RTCHitN)auVar80[0xf];
                        fVar79 = *(float *)(local_29a0 + uVar62) - fVar79;
                        auVar88._4_4_ = fVar79;
                        auVar88._0_4_ = fVar79;
                        auVar88._8_4_ = fVar79;
                        auVar88._12_4_ = fVar79;
                        auVar88._16_4_ = fVar79;
                        auVar88._20_4_ = fVar79;
                        auVar88._24_4_ = fVar79;
                        auVar88._28_4_ = fVar79;
                        auVar116 = in_ZMM13._0_32_;
                        auVar95 = vfmadd213ps_fma(auVar88,auVar116,auVar138);
                        auVar129._8_8_ = 0;
                        auVar129._0_8_ = *(ulong *)(lVar64 + 0x24);
                        auVar80 = vpmovzxbd_avx(auVar129);
                        auVar80 = vcvtdq2ps_avx(auVar80);
                        local_2b00._0_16_ = vfmadd213ps_fma(auVar80,auVar96,auVar113);
                        fVar79 = *(float *)(local_2b00 + uVar62);
                        auVar117._4_4_ = fVar79;
                        auVar117._0_4_ = fVar79;
                        auVar117._8_4_ = fVar79;
                        auVar117._12_4_ = fVar79;
                        auVar117._16_4_ = fVar79;
                        auVar117._20_4_ = fVar79;
                        auVar117._24_4_ = fVar79;
                        auVar117._28_4_ = fVar79;
                        auVar97._8_8_ = 0;
                        auVar97._0_8_ = *(ulong *)(lVar64 + 0x54);
                        auVar80 = vpmovzxbd_avx(auVar97);
                        auVar80 = vcvtdq2ps_avx(auVar80);
                        auVar80 = vfmadd213ps_fma(auVar80,auVar144,auVar157);
                        local_29a0[0] = (RTCHitN)auVar80[0];
                        local_29a0[1] = (RTCHitN)auVar80[1];
                        local_29a0[2] = (RTCHitN)auVar80[2];
                        local_29a0[3] = (RTCHitN)auVar80[3];
                        local_29a0[4] = (RTCHitN)auVar80[4];
                        local_29a0[5] = (RTCHitN)auVar80[5];
                        local_29a0[6] = (RTCHitN)auVar80[6];
                        local_29a0[7] = (RTCHitN)auVar80[7];
                        local_29a0[8] = (RTCHitN)auVar80[8];
                        local_29a0[9] = (RTCHitN)auVar80[9];
                        local_29a0[10] = (RTCHitN)auVar80[10];
                        local_29a0[0xb] = (RTCHitN)auVar80[0xb];
                        local_29a0[0xc] = (RTCHitN)auVar80[0xc];
                        local_29a0[0xd] = (RTCHitN)auVar80[0xd];
                        local_29a0[0xe] = (RTCHitN)auVar80[0xe];
                        local_29a0[0xf] = (RTCHitN)auVar80[0xf];
                        fVar79 = *(float *)(local_29a0 + uVar62) - fVar79;
                        auVar100._4_4_ = fVar79;
                        auVar100._0_4_ = fVar79;
                        auVar100._8_4_ = fVar79;
                        auVar100._12_4_ = fVar79;
                        auVar100._16_4_ = fVar79;
                        auVar100._20_4_ = fVar79;
                        auVar100._24_4_ = fVar79;
                        auVar100._28_4_ = fVar79;
                        auVar130._8_8_ = 0;
                        auVar130._0_8_ = *(ulong *)(lVar64 + 0x28);
                        auVar80 = vpmovzxbd_avx(auVar130);
                        auVar80 = vcvtdq2ps_avx(auVar80);
                        uVar75 = *(undefined4 *)(lVar64 + 0x48);
                        auVar145._4_4_ = uVar75;
                        auVar145._0_4_ = uVar75;
                        auVar145._8_4_ = uVar75;
                        auVar145._12_4_ = uVar75;
                        uVar75 = *(undefined4 *)(lVar64 + 0x3c);
                        auVar158._4_4_ = uVar75;
                        auVar158._0_4_ = uVar75;
                        auVar158._8_4_ = uVar75;
                        auVar158._12_4_ = uVar75;
                        local_2b00._0_16_ = vfmadd213ps_fma(auVar80,auVar145,auVar158);
                        fVar79 = *(float *)(local_2b00 + uVar62);
                        auVar139._4_4_ = fVar79;
                        auVar139._0_4_ = fVar79;
                        auVar139._8_4_ = fVar79;
                        auVar139._12_4_ = fVar79;
                        auVar139._16_4_ = fVar79;
                        auVar139._20_4_ = fVar79;
                        auVar139._24_4_ = fVar79;
                        auVar139._28_4_ = fVar79;
                        auVar81 = vfmadd213ps_fma(auVar100,auVar116,auVar117);
                        auVar114._8_8_ = 0;
                        auVar114._0_8_ = *(ulong *)(lVar64 + 0x58);
                        auVar80 = vpmovzxbd_avx(auVar114);
                        auVar80 = vcvtdq2ps_avx(auVar80);
                        uVar75 = *(undefined4 *)(lVar64 + 0x78);
                        auVar173._4_4_ = uVar75;
                        auVar173._0_4_ = uVar75;
                        auVar173._8_4_ = uVar75;
                        auVar173._12_4_ = uVar75;
                        uVar75 = *(undefined4 *)(lVar64 + 0x6c);
                        auVar185._4_4_ = uVar75;
                        auVar185._0_4_ = uVar75;
                        auVar185._8_4_ = uVar75;
                        auVar185._12_4_ = uVar75;
                        auVar80 = vfmadd213ps_fma(auVar80,auVar173,auVar185);
                        local_29a0[0] = (RTCHitN)auVar80[0];
                        local_29a0[1] = (RTCHitN)auVar80[1];
                        local_29a0[2] = (RTCHitN)auVar80[2];
                        local_29a0[3] = (RTCHitN)auVar80[3];
                        local_29a0[4] = (RTCHitN)auVar80[4];
                        local_29a0[5] = (RTCHitN)auVar80[5];
                        local_29a0[6] = (RTCHitN)auVar80[6];
                        local_29a0[7] = (RTCHitN)auVar80[7];
                        local_29a0[8] = (RTCHitN)auVar80[8];
                        local_29a0[9] = (RTCHitN)auVar80[9];
                        local_29a0[10] = (RTCHitN)auVar80[10];
                        local_29a0[0xb] = (RTCHitN)auVar80[0xb];
                        local_29a0[0xc] = (RTCHitN)auVar80[0xc];
                        local_29a0[0xd] = (RTCHitN)auVar80[0xd];
                        local_29a0[0xe] = (RTCHitN)auVar80[0xe];
                        local_29a0[0xf] = (RTCHitN)auVar80[0xf];
                        fVar79 = *(float *)(local_29a0 + uVar62) - fVar79;
                        auVar118._4_4_ = fVar79;
                        auVar118._0_4_ = fVar79;
                        auVar118._8_4_ = fVar79;
                        auVar118._12_4_ = fVar79;
                        auVar118._16_4_ = fVar79;
                        auVar118._20_4_ = fVar79;
                        auVar118._24_4_ = fVar79;
                        auVar118._28_4_ = fVar79;
                        auVar82 = vfmadd213ps_fma(auVar118,auVar116,auVar139);
                        auVar131._8_8_ = 0;
                        auVar131._0_8_ = *(ulong *)(lVar64 + 0x2c);
                        auVar80 = vpmovzxbd_avx(auVar131);
                        auVar80 = vcvtdq2ps_avx(auVar80);
                        local_2b00._0_16_ = vfmadd213ps_fma(auVar80,auVar145,auVar158);
                        fVar79 = *(float *)(local_2b00 + uVar62);
                        auVar150._4_4_ = fVar79;
                        auVar150._0_4_ = fVar79;
                        auVar150._8_4_ = fVar79;
                        auVar150._12_4_ = fVar79;
                        auVar150._16_4_ = fVar79;
                        auVar150._20_4_ = fVar79;
                        auVar150._24_4_ = fVar79;
                        auVar150._28_4_ = fVar79;
                        auVar132._8_8_ = 0;
                        auVar132._0_8_ = *(ulong *)(lVar64 + 0x5c);
                        auVar80 = vpmovzxbd_avx(auVar132);
                        auVar80 = vcvtdq2ps_avx(auVar80);
                        auVar80 = vfmadd213ps_fma(auVar80,auVar173,auVar185);
                        local_29a0[0] = (RTCHitN)auVar80[0];
                        local_29a0[1] = (RTCHitN)auVar80[1];
                        local_29a0[2] = (RTCHitN)auVar80[2];
                        local_29a0[3] = (RTCHitN)auVar80[3];
                        local_29a0[4] = (RTCHitN)auVar80[4];
                        local_29a0[5] = (RTCHitN)auVar80[5];
                        local_29a0[6] = (RTCHitN)auVar80[6];
                        local_29a0[7] = (RTCHitN)auVar80[7];
                        local_29a0[8] = (RTCHitN)auVar80[8];
                        local_29a0[9] = (RTCHitN)auVar80[9];
                        local_29a0[10] = (RTCHitN)auVar80[10];
                        local_29a0[0xb] = (RTCHitN)auVar80[0xb];
                        local_29a0[0xc] = (RTCHitN)auVar80[0xc];
                        local_29a0[0xd] = (RTCHitN)auVar80[0xd];
                        local_29a0[0xe] = (RTCHitN)auVar80[0xe];
                        local_29a0[0xf] = (RTCHitN)auVar80[0xf];
                        fVar79 = *(float *)(local_29a0 + uVar62) - fVar79;
                        auVar140._4_4_ = fVar79;
                        auVar140._0_4_ = fVar79;
                        auVar140._8_4_ = fVar79;
                        auVar140._12_4_ = fVar79;
                        auVar140._16_4_ = fVar79;
                        auVar140._20_4_ = fVar79;
                        auVar140._24_4_ = fVar79;
                        auVar140._28_4_ = fVar79;
                        auVar159._8_8_ = 0;
                        auVar159._0_8_ = *(ulong *)(lVar64 + 0x30);
                        auVar80 = vpmovzxbd_avx(auVar159);
                        auVar80 = vcvtdq2ps_avx(auVar80);
                        uVar75 = *(undefined4 *)(lVar64 + 0x4c);
                        auVar174._4_4_ = uVar75;
                        auVar174._0_4_ = uVar75;
                        auVar174._8_4_ = uVar75;
                        auVar174._12_4_ = uVar75;
                        uVar75 = *(undefined4 *)(lVar64 + 0x40);
                        auVar186._4_4_ = uVar75;
                        auVar186._0_4_ = uVar75;
                        auVar186._8_4_ = uVar75;
                        auVar186._12_4_ = uVar75;
                        local_2b00._0_16_ = vfmadd213ps_fma(auVar80,auVar174,auVar186);
                        fVar79 = *(float *)(local_2b00 + uVar62);
                        auVar168._4_4_ = fVar79;
                        auVar168._0_4_ = fVar79;
                        auVar168._8_4_ = fVar79;
                        auVar168._12_4_ = fVar79;
                        auVar168._16_4_ = fVar79;
                        auVar168._20_4_ = fVar79;
                        auVar168._24_4_ = fVar79;
                        auVar168._28_4_ = fVar79;
                        auVar96 = vfmadd213ps_fma(auVar140,auVar116,auVar150);
                        auVar146._8_8_ = 0;
                        auVar146._0_8_ = *(ulong *)(lVar64 + 0x60);
                        auVar80 = vpmovzxbd_avx(auVar146);
                        auVar80 = vcvtdq2ps_avx(auVar80);
                        uVar75 = *(undefined4 *)(lVar64 + 0x7c);
                        auVar195._4_4_ = uVar75;
                        auVar195._0_4_ = uVar75;
                        auVar195._8_4_ = uVar75;
                        auVar195._12_4_ = uVar75;
                        uVar75 = *(undefined4 *)(lVar64 + 0x70);
                        auVar207._4_4_ = uVar75;
                        auVar207._0_4_ = uVar75;
                        auVar207._8_4_ = uVar75;
                        auVar207._12_4_ = uVar75;
                        auVar80 = vfmadd213ps_fma(auVar80,auVar195,auVar207);
                        local_29a0[0] = (RTCHitN)auVar80[0];
                        local_29a0[1] = (RTCHitN)auVar80[1];
                        local_29a0[2] = (RTCHitN)auVar80[2];
                        local_29a0[3] = (RTCHitN)auVar80[3];
                        local_29a0[4] = (RTCHitN)auVar80[4];
                        local_29a0[5] = (RTCHitN)auVar80[5];
                        local_29a0[6] = (RTCHitN)auVar80[6];
                        local_29a0[7] = (RTCHitN)auVar80[7];
                        local_29a0[8] = (RTCHitN)auVar80[8];
                        local_29a0[9] = (RTCHitN)auVar80[9];
                        local_29a0[10] = (RTCHitN)auVar80[10];
                        local_29a0[0xb] = (RTCHitN)auVar80[0xb];
                        local_29a0[0xc] = (RTCHitN)auVar80[0xc];
                        local_29a0[0xd] = (RTCHitN)auVar80[0xd];
                        local_29a0[0xe] = (RTCHitN)auVar80[0xe];
                        local_29a0[0xf] = (RTCHitN)auVar80[0xf];
                        fVar79 = *(float *)(local_29a0 + uVar62) - fVar79;
                        auVar151._4_4_ = fVar79;
                        auVar151._0_4_ = fVar79;
                        auVar151._8_4_ = fVar79;
                        auVar151._12_4_ = fVar79;
                        auVar151._16_4_ = fVar79;
                        auVar151._20_4_ = fVar79;
                        auVar151._24_4_ = fVar79;
                        auVar151._28_4_ = fVar79;
                        auVar97 = vfmadd213ps_fma(auVar151,auVar116,auVar168);
                        auVar160._8_8_ = 0;
                        auVar160._0_8_ = *(ulong *)(lVar64 + 0x34);
                        auVar80 = vpmovzxbd_avx(auVar160);
                        auVar80 = vcvtdq2ps_avx(auVar80);
                        local_2b00._0_16_ = vfmadd213ps_fma(auVar80,auVar174,auVar186);
                        fVar79 = *(float *)(local_2b00 + uVar62);
                        auVar169._4_4_ = fVar79;
                        auVar169._0_4_ = fVar79;
                        auVar169._8_4_ = fVar79;
                        auVar169._12_4_ = fVar79;
                        auVar169._16_4_ = fVar79;
                        auVar169._20_4_ = fVar79;
                        auVar169._24_4_ = fVar79;
                        auVar169._28_4_ = fVar79;
                        auVar175._8_8_ = 0;
                        auVar175._0_8_ = *(ulong *)(lVar64 + 100);
                        auVar80 = vpmovzxbd_avx(auVar175);
                        auVar80 = vcvtdq2ps_avx(auVar80);
                        auVar80 = vfmadd213ps_fma(auVar80,auVar195,auVar207);
                        local_29a0[0] = (RTCHitN)auVar80[0];
                        local_29a0[1] = (RTCHitN)auVar80[1];
                        local_29a0[2] = (RTCHitN)auVar80[2];
                        local_29a0[3] = (RTCHitN)auVar80[3];
                        local_29a0[4] = (RTCHitN)auVar80[4];
                        local_29a0[5] = (RTCHitN)auVar80[5];
                        local_29a0[6] = (RTCHitN)auVar80[6];
                        local_29a0[7] = (RTCHitN)auVar80[7];
                        local_29a0[8] = (RTCHitN)auVar80[8];
                        local_29a0[9] = (RTCHitN)auVar80[9];
                        local_29a0[10] = (RTCHitN)auVar80[10];
                        local_29a0[0xb] = (RTCHitN)auVar80[0xb];
                        local_29a0[0xc] = (RTCHitN)auVar80[0xc];
                        local_29a0[0xd] = (RTCHitN)auVar80[0xd];
                        local_29a0[0xe] = (RTCHitN)auVar80[0xe];
                        local_29a0[0xf] = (RTCHitN)auVar80[0xf];
                        fVar79 = *(float *)(local_29a0 + uVar62) - fVar79;
                        auVar179._4_4_ = fVar79;
                        auVar179._0_4_ = fVar79;
                        auVar179._8_4_ = fVar79;
                        auVar179._12_4_ = fVar79;
                        auVar179._16_4_ = fVar79;
                        auVar179._20_4_ = fVar79;
                        auVar179._24_4_ = fVar79;
                        auVar179._28_4_ = fVar79;
                        auVar80 = vfmadd213ps_fma(auVar179,auVar116,auVar169);
                        auVar53._8_8_ = local_2cc0._8_8_;
                        auVar53._0_8_ = local_2cc0._0_8_;
                        auVar53._16_8_ = local_2cc0._16_8_;
                        auVar53._24_8_ = local_2cc0._24_8_;
                        auVar55._8_8_ = local_2cc0._40_8_;
                        auVar55._0_8_ = local_2cc0._32_8_;
                        auVar55._16_8_ = local_2cc0._48_8_;
                        auVar55._24_8_ = local_2cc0._56_8_;
                        auVar57._8_8_ = local_2cc0._72_8_;
                        auVar57._0_8_ = local_2cc0._64_8_;
                        auVar57._16_8_ = local_2cc0._80_8_;
                        auVar57._24_8_ = local_2cc0._88_8_;
                        auVar116 = vsubps_avx(ZEXT1632(auVar95),auVar53);
                        auVar26._4_4_ = local_2c00._4_4_ * auVar116._4_4_;
                        auVar26._0_4_ = local_2c00._0_4_ * auVar116._0_4_;
                        auVar26._8_4_ = local_2c00._8_4_ * auVar116._8_4_;
                        auVar26._12_4_ = local_2c00._12_4_ * auVar116._12_4_;
                        auVar26._16_4_ = local_2c00._16_4_ * auVar116._16_4_;
                        auVar26._20_4_ = local_2c00._20_4_ * auVar116._20_4_;
                        auVar26._24_4_ = local_2c00._24_4_ * auVar116._24_4_;
                        auVar26._28_4_ = auVar116._28_4_;
                        auVar116 = vsubps_avx(ZEXT1632(auVar82),auVar55);
                        auVar27._4_4_ = (float)local_2be0._4_4_ * auVar116._4_4_;
                        auVar27._0_4_ = (float)local_2be0._0_4_ * auVar116._0_4_;
                        auVar27._8_4_ = fStack_2bd8 * auVar116._8_4_;
                        auVar27._12_4_ = fStack_2bd4 * auVar116._12_4_;
                        auVar27._16_4_ = fStack_2bd0 * auVar116._16_4_;
                        auVar27._20_4_ = fStack_2bcc * auVar116._20_4_;
                        auVar27._24_4_ = fStack_2bc8 * auVar116._24_4_;
                        auVar27._28_4_ = auVar116._28_4_;
                        auVar128 = ZEXT3264(auVar27);
                        auVar116 = vsubps_avx(ZEXT1632(auVar97),auVar57);
                        auVar28._4_4_ = (float)local_2bc0._4_4_ * auVar116._4_4_;
                        auVar28._0_4_ = (float)local_2bc0._0_4_ * auVar116._0_4_;
                        auVar28._8_4_ = fStack_2bb8 * auVar116._8_4_;
                        auVar28._12_4_ = fStack_2bb4 * auVar116._12_4_;
                        auVar28._16_4_ = fStack_2bb0 * auVar116._16_4_;
                        auVar28._20_4_ = fStack_2bac * auVar116._20_4_;
                        auVar28._24_4_ = fStack_2ba8 * auVar116._24_4_;
                        auVar28._28_4_ = auVar116._28_4_;
                        auVar116 = vsubps_avx(ZEXT1632(auVar81),auVar53);
                        auVar29._4_4_ = local_2c00._4_4_ * auVar116._4_4_;
                        auVar29._0_4_ = local_2c00._0_4_ * auVar116._0_4_;
                        auVar29._8_4_ = local_2c00._8_4_ * auVar116._8_4_;
                        auVar29._12_4_ = local_2c00._12_4_ * auVar116._12_4_;
                        auVar29._16_4_ = local_2c00._16_4_ * auVar116._16_4_;
                        auVar29._20_4_ = local_2c00._20_4_ * auVar116._20_4_;
                        auVar29._24_4_ = local_2c00._24_4_ * auVar116._24_4_;
                        auVar29._28_4_ = auVar116._28_4_;
                        auVar116 = vsubps_avx(ZEXT1632(auVar96),auVar55);
                        auVar30._4_4_ = (float)local_2be0._4_4_ * auVar116._4_4_;
                        auVar30._0_4_ = (float)local_2be0._0_4_ * auVar116._0_4_;
                        auVar30._8_4_ = fStack_2bd8 * auVar116._8_4_;
                        auVar30._12_4_ = fStack_2bd4 * auVar116._12_4_;
                        auVar30._16_4_ = fStack_2bd0 * auVar116._16_4_;
                        auVar30._20_4_ = fStack_2bcc * auVar116._20_4_;
                        auVar30._24_4_ = fStack_2bc8 * auVar116._24_4_;
                        auVar30._28_4_ = auVar116._28_4_;
                        auVar116 = vsubps_avx(ZEXT1632(auVar80),auVar57);
                        auVar31._4_4_ = (float)local_2bc0._4_4_ * auVar116._4_4_;
                        auVar31._0_4_ = (float)local_2bc0._0_4_ * auVar116._0_4_;
                        auVar31._8_4_ = fStack_2bb8 * auVar116._8_4_;
                        auVar31._12_4_ = fStack_2bb4 * auVar116._12_4_;
                        auVar31._16_4_ = fStack_2bb0 * auVar116._16_4_;
                        auVar31._20_4_ = fStack_2bac * auVar116._20_4_;
                        auVar31._24_4_ = fStack_2ba8 * auVar116._24_4_;
                        auVar31._28_4_ = auVar116._28_4_;
                        auVar116 = vminps_avx(auVar26,auVar29);
                        auVar85 = vminps_avx(auVar27,auVar30);
                        auVar116 = vmaxps_avx(auVar116,auVar85);
                        auVar85 = vminps_avx(auVar28,auVar31);
                        auVar116 = vmaxps_avx(auVar116,auVar85);
                        auVar32._4_4_ = auVar116._4_4_ * 0.99999964;
                        auVar32._0_4_ = auVar116._0_4_ * 0.99999964;
                        auVar32._8_4_ = auVar116._8_4_ * 0.99999964;
                        auVar32._12_4_ = auVar116._12_4_ * 0.99999964;
                        auVar32._16_4_ = auVar116._16_4_ * 0.99999964;
                        auVar32._20_4_ = auVar116._20_4_ * 0.99999964;
                        auVar32._24_4_ = auVar116._24_4_ * 0.99999964;
                        auVar32._28_4_ = auVar116._28_4_;
                        auVar116 = vmaxps_avx(auVar26,auVar29);
                        auVar85 = vmaxps_avx(auVar27,auVar30);
                        auVar85 = vminps_avx(auVar116,auVar85);
                        auVar116 = vmaxps_avx(auVar28,auVar31);
                        auVar116 = vminps_avx(auVar85,auVar116);
                        auVar33._4_4_ = auVar116._4_4_ * 1.0000004;
                        auVar33._0_4_ = auVar116._0_4_ * 1.0000004;
                        auVar33._8_4_ = auVar116._8_4_ * 1.0000004;
                        auVar33._12_4_ = auVar116._12_4_ * 1.0000004;
                        auVar33._16_4_ = auVar116._16_4_ * 1.0000004;
                        auVar33._20_4_ = auVar116._20_4_ * 1.0000004;
                        auVar33._24_4_ = auVar116._24_4_ * 1.0000004;
                        auVar33._28_4_ = auVar116._28_4_;
                        auVar116 = vmaxps_avx(auVar32,local_2b40);
                        auVar85 = vminps_avx(auVar33,local_2b20);
                        auVar116 = vcmpps_avx(auVar116,auVar85,2);
                        auVar116 = auVar135 & auVar116;
                        if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar116 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar116 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar116 >> 0x7f,0) == '\0')
                              && (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar116 >> 0xbf,0) == '\0') &&
                            (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar116[0x1f]) {
                          bVar78 = false;
                        }
                        else {
                          uVar2 = *(ushort *)(lVar64 + lVar61 * 8);
                          uVar3 = *(ushort *)(lVar64 + 2 + lVar61 * 8);
                          uVar62 = *(uint *)(lVar64 + 0x88);
                          unaff_R14 = (ulong)uVar62;
                          uVar4 = *(uint *)(lVar64 + 4 + lVar61 * 8);
                          uVar58 = vmovmskps_avx(auVar135);
                          local_2ce0 = auVar135;
                          if (uVar58 != 0) {
                            local_27c0 = auVar135;
                            uVar67 = (ulong)(uVar58 & 0xff);
                            local_2f0c = uVar2 & 0x7fff;
                            local_2f10 = (uint)uVar3;
                            local_2f14 = local_2f10 & 0x7fff;
                            local_2e30 = (ulong)(-1 < (short)uVar2);
                            auVar89._0_8_ = (ulong)CONCAT24(uVar2,(uint)uVar2) & 0x7fff00007fff;
                            auVar89._8_4_ = local_2f0c;
                            auVar89._12_4_ = local_2f0c;
                            auVar89._16_4_ = local_2f0c;
                            auVar89._20_4_ = local_2f0c;
                            auVar89._24_4_ = local_2f0c;
                            auVar89._28_4_ = local_2f0c;
                            auVar135 = vpaddd_avx2(auVar89,_DAT_01fec4a0);
                            auVar101._0_8_ = (ulong)CONCAT24(uVar3,local_2f10) & 0x7fff00007fff;
                            auVar101._8_4_ = local_2f14;
                            auVar101._12_4_ = local_2f14;
                            auVar101._16_4_ = local_2f14;
                            auVar101._20_4_ = local_2f14;
                            auVar101._24_4_ = local_2f14;
                            auVar101._28_4_ = local_2f14;
                            auVar116 = vpaddd_avx2(auVar101,_DAT_01fec4c0);
                            _local_2840 = vcvtdq2ps_avx(auVar135);
                            _local_2860 = vcvtdq2ps_avx(auVar116);
                            local_27e0 = uVar62;
                            uStack_27dc = uVar62;
                            uStack_27d8 = uVar62;
                            uStack_27d4 = uVar62;
                            uStack_27d0 = uVar62;
                            uStack_27cc = uVar62;
                            uStack_27c8 = uVar62;
                            uStack_27c4 = uVar62;
                            local_2800 = uVar4;
                            uStack_27fc = uVar4;
                            uStack_27f8 = uVar4;
                            uStack_27f4 = uVar4;
                            uStack_27f0 = uVar4;
                            uStack_27ec = uVar4;
                            uStack_27e8 = uVar4;
                            uStack_27e4 = uVar4;
                            pRVar74 = ray;
                            uVar68 = unaff_R14;
                            pRVar77 = context;
                            local_2e48 = uVar70;
                            local_2e28 = (ulong)uVar4;
                            local_2e20 = unaff_R14;
                            do {
                              unaff_R14 = local_2e20;
                              context = local_2e38;
                              ray = local_2e40;
                              local_2d40._0_8_ = uVar67;
                              sVar69 = 0;
                              for (; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
                                sVar69 = sVar69 + 1;
                              }
                              local_2e08 = pRVar77->scene;
                              pGVar5 = (local_2e08->geometries).items[uVar68].ptr;
                              local_2e10 = *(long *)&pGVar5->field_0x58;
                              BVar1 = pGVar5->time_range;
                              auVar83._8_8_ = 0;
                              auVar83._0_4_ = BVar1.lower;
                              auVar83._4_4_ = BVar1.upper;
                              fVar79 = BVar1.lower;
                              auVar102._4_4_ = fVar79;
                              auVar102._0_4_ = fVar79;
                              auVar102._8_4_ = fVar79;
                              auVar102._12_4_ = fVar79;
                              auVar102._16_4_ = fVar79;
                              auVar102._20_4_ = fVar79;
                              auVar102._24_4_ = fVar79;
                              auVar102._28_4_ = fVar79;
                              fVar79 = pGVar5->fnumTimeSegments;
                              auVar135 = vsubps_avx(*(undefined1 (*) [32])(pRVar74 + 0xe0),auVar102)
                              ;
                              auVar80 = vmovshdup_avx(auVar83);
                              auVar80 = vsubps_avx(auVar80,auVar83);
                              auVar90._0_4_ = auVar80._0_4_;
                              auVar90._4_4_ = auVar90._0_4_;
                              auVar90._8_4_ = auVar90._0_4_;
                              auVar90._12_4_ = auVar90._0_4_;
                              auVar90._16_4_ = auVar90._0_4_;
                              auVar90._20_4_ = auVar90._0_4_;
                              auVar90._24_4_ = auVar90._0_4_;
                              auVar90._28_4_ = auVar90._0_4_;
                              auVar135 = vdivps_avx(auVar135,auVar90);
                              local_2e18 = pGVar5[1].super_RefCount.refCounter.
                                           super___atomic_base<unsigned_long>._M_i * local_2e28;
                              auVar34._4_4_ = fVar79 * auVar135._4_4_;
                              auVar34._0_4_ = fVar79 * auVar135._0_4_;
                              auVar34._8_4_ = fVar79 * auVar135._8_4_;
                              auVar34._12_4_ = fVar79 * auVar135._12_4_;
                              auVar34._16_4_ = fVar79 * auVar135._16_4_;
                              auVar34._20_4_ = fVar79 * auVar135._20_4_;
                              auVar34._24_4_ = fVar79 * auVar135._24_4_;
                              auVar34._28_4_ = auVar135._28_4_;
                              auVar135 = vroundps_avx(auVar34,1);
                              fVar79 = fVar79 + -1.0;
                              auVar119._4_4_ = fVar79;
                              auVar119._0_4_ = fVar79;
                              auVar119._8_4_ = fVar79;
                              auVar119._12_4_ = fVar79;
                              auVar119._16_4_ = fVar79;
                              auVar119._20_4_ = fVar79;
                              auVar119._24_4_ = fVar79;
                              auVar119._28_4_ = fVar79;
                              auVar135 = vminps_avx(auVar135,auVar119);
                              auVar135 = vmaxps_avx(auVar135,_DAT_01faff00);
                              local_2640 = vsubps_avx(auVar34,auVar135);
                              local_2660 = vcvtps2dq_avx(auVar135);
                              uVar67 = (ulong)((uint)sVar69 * 4);
                              uVar62 = *(uint *)(local_2e10 + 4 + local_2e18);
                              uVar71 = (ulong)uVar62;
                              uVar68 = (ulong)(uVar62 * local_2f14 +
                                              *(int *)(local_2e10 + local_2e18) + local_2f0c);
                              lVar61 = *(long *)&pGVar5[2].numPrimitives;
                              lVar65 = (long)*(int *)(local_2660 + uVar67) * 0x38;
                              lVar6 = *(long *)(lVar61 + lVar65);
                              lVar7 = *(long *)(lVar61 + 0x10 + lVar65);
                              auVar80 = *(undefined1 (*) [16])(lVar6 + lVar7 * uVar68);
                              lVar8 = *(long *)(lVar61 + 0x48 + lVar65);
                              auVar95 = *(undefined1 (*) [16])(lVar6 + (uVar68 + 1) * lVar7);
                              lVar64 = uVar68 + uVar71;
                              auVar81 = *(undefined1 (*) [16])(lVar6 + lVar64 * lVar7);
                              lVar76 = uVar68 + uVar71 + 1;
                              auVar96 = *(undefined1 (*) [16])(lVar6 + lVar76 * lVar7);
                              lVar63 = uVar68 + local_2e30 + 1;
                              auVar82 = *(undefined1 (*) [16])(lVar6 + lVar63 * lVar7);
                              lVar66 = local_2e30 + lVar76;
                              uVar70 = 0;
                              if (-1 < (short)local_2f10) {
                                uVar70 = uVar71;
                              }
                              auVar144 = *(undefined1 (*) [16])(lVar6 + lVar66 * lVar7);
                              auVar97 = *(undefined1 (*) [16])(lVar6 + (lVar64 + uVar70) * lVar7);
                              auVar113 = *(undefined1 (*) [16])(lVar6 + (lVar76 + uVar70) * lVar7);
                              auVar114 = *(undefined1 (*) [16])(lVar6 + lVar7 * (uVar70 + lVar66));
                              lVar61 = *(long *)(lVar61 + 0x38 + lVar65);
                              uVar75 = *(undefined4 *)(local_2640 + uVar67);
                              auVar227._4_4_ = uVar75;
                              auVar227._0_4_ = uVar75;
                              auVar227._8_4_ = uVar75;
                              auVar227._12_4_ = uVar75;
                              auVar129 = vsubps_avx(*(undefined1 (*) [16])(lVar61 + lVar8 * uVar68),
                                                    auVar80);
                              auVar129 = vfmadd213ps_fma(auVar129,auVar227,auVar80);
                              auVar80 = vsubps_avx(*(undefined1 (*) [16])
                                                    (lVar61 + lVar8 * (uVar68 + 1)),auVar95);
                              auVar130 = vfmadd213ps_fma(auVar80,auVar227,auVar95);
                              auVar80 = vsubps_avx(*(undefined1 (*) [16])(lVar61 + lVar8 * lVar64),
                                                   auVar81);
                              auVar131 = vfmadd213ps_fma(auVar80,auVar227,auVar81);
                              auVar80 = vsubps_avx(*(undefined1 (*) [16])(lVar61 + lVar8 * lVar76),
                                                   auVar96);
                              auVar132 = vfmadd213ps_fma(auVar80,auVar227,auVar96);
                              auVar80 = vsubps_avx(*(undefined1 (*) [16])(lVar61 + lVar8 * lVar63),
                                                   auVar82);
                              auVar95 = vfmadd213ps_fma(auVar80,auVar227,auVar82);
                              auVar80 = vsubps_avx(*(undefined1 (*) [16])(lVar61 + lVar8 * lVar66),
                                                   auVar144);
                              auVar144 = vfmadd213ps_fma(auVar80,auVar227,auVar144);
                              auVar80 = vsubps_avx(*(undefined1 (*) [16])
                                                    (lVar61 + lVar8 * (lVar64 + uVar70)),auVar97);
                              auVar145 = vfmadd213ps_fma(auVar80,auVar227,auVar97);
                              auVar80 = vsubps_avx(*(undefined1 (*) [16])
                                                    (lVar61 + lVar8 * (lVar76 + uVar70)),auVar113);
                              auVar146 = vfmadd213ps_fma(auVar80,auVar227,auVar113);
                              auVar80 = vsubps_avx(*(undefined1 (*) [16])
                                                    (lVar61 + (uVar70 + lVar66) * lVar8),auVar114);
                              auVar157 = vfmadd213ps_fma(auVar80,auVar227,auVar114);
                              auVar81 = vunpcklps_avx(auVar130,auVar144);
                              auVar80 = vunpckhps_avx(auVar130,auVar144);
                              auVar82 = vunpcklps_avx(auVar95,auVar132);
                              auVar95 = vunpckhps_avx(auVar95,auVar132);
                              auVar96 = vunpcklps_avx(auVar80,auVar95);
                              auVar97 = vunpcklps_avx(auVar81,auVar82);
                              auVar80 = vunpckhps_avx(auVar81,auVar82);
                              auVar82 = vunpcklps_avx(auVar131,auVar146);
                              auVar95 = vunpckhps_avx(auVar131,auVar146);
                              auVar113 = vunpcklps_avx(auVar132,auVar145);
                              auVar81 = vunpckhps_avx(auVar132,auVar145);
                              auVar81 = vunpcklps_avx(auVar95,auVar81);
                              auVar114 = vunpcklps_avx(auVar82,auVar113);
                              auVar95 = vunpckhps_avx(auVar82,auVar113);
                              auVar170._16_16_ = auVar146;
                              auVar170._0_16_ = auVar131;
                              auVar91._16_16_ = auVar144;
                              auVar91._0_16_ = auVar130;
                              auVar135 = vunpcklps_avx(auVar91,auVar170);
                              auVar190._16_16_ = auVar132;
                              auVar190._0_16_ = auVar129;
                              auVar103._16_16_ = auVar157;
                              auVar103._0_16_ = auVar132;
                              auVar116 = vunpcklps_avx(auVar190,auVar103);
                              auVar133 = vunpcklps_avx(auVar116,auVar135);
                              auVar135 = vunpckhps_avx(auVar116,auVar135);
                              auVar116 = vunpckhps_avx(auVar91,auVar170);
                              auVar85 = vunpckhps_avx(auVar190,auVar103);
                              auVar116 = vunpcklps_avx(auVar85,auVar116);
                              auVar171._16_16_ = auVar97;
                              auVar171._0_16_ = auVar97;
                              auVar220._16_16_ = auVar80;
                              auVar220._0_16_ = auVar80;
                              auVar180._16_16_ = auVar96;
                              auVar180._0_16_ = auVar96;
                              auVar228._16_16_ = auVar114;
                              auVar228._0_16_ = auVar114;
                              auVar218._16_16_ = auVar95;
                              auVar218._0_16_ = auVar95;
                              uVar75 = *(undefined4 *)(local_2e40 + uVar67);
                              auVar198._4_4_ = uVar75;
                              auVar198._0_4_ = uVar75;
                              auVar198._8_4_ = uVar75;
                              auVar198._12_4_ = uVar75;
                              auVar198._16_4_ = uVar75;
                              auVar198._20_4_ = uVar75;
                              auVar198._24_4_ = uVar75;
                              auVar198._28_4_ = uVar75;
                              uVar75 = *(undefined4 *)(local_2e40 + uVar67 + 0x20);
                              auVar210._4_4_ = uVar75;
                              auVar210._0_4_ = uVar75;
                              auVar210._8_4_ = uVar75;
                              auVar210._12_4_ = uVar75;
                              auVar210._16_4_ = uVar75;
                              auVar210._20_4_ = uVar75;
                              auVar210._24_4_ = uVar75;
                              auVar210._28_4_ = uVar75;
                              uVar75 = *(undefined4 *)(local_2e40 + uVar67 + 0x40);
                              auVar217._4_4_ = uVar75;
                              auVar217._0_4_ = uVar75;
                              auVar217._8_4_ = uVar75;
                              auVar217._12_4_ = uVar75;
                              auVar217._16_4_ = uVar75;
                              auVar217._20_4_ = uVar75;
                              auVar217._24_4_ = uVar75;
                              auVar217._28_4_ = uVar75;
                              auVar120._16_16_ = auVar81;
                              auVar120._0_16_ = auVar81;
                              local_2ea0 = vsubps_avx(auVar133,auVar198);
                              local_2d60 = vsubps_avx(auVar135,auVar210);
                              local_2680 = vsubps_avx(auVar116,auVar217);
                              auVar135 = vsubps_avx(auVar171,auVar198);
                              auVar116 = vsubps_avx(auVar220,auVar210);
                              auVar85 = vsubps_avx(auVar180,auVar217);
                              auVar133 = vsubps_avx(auVar228,auVar198);
                              auVar134 = vsubps_avx(auVar218,auVar210);
                              auVar147 = vsubps_avx(auVar120,auVar217);
                              local_26a0 = vsubps_avx(auVar133,local_2ea0);
                              local_26e0 = vsubps_avx(auVar134,local_2d60);
                              local_26c0 = vsubps_avx(auVar147,local_2680);
                              auVar92._0_4_ = auVar133._0_4_ + local_2ea0._0_4_;
                              auVar92._4_4_ = auVar133._4_4_ + local_2ea0._4_4_;
                              auVar92._8_4_ = auVar133._8_4_ + local_2ea0._8_4_;
                              auVar92._12_4_ = auVar133._12_4_ + local_2ea0._12_4_;
                              auVar92._16_4_ = auVar133._16_4_ + local_2ea0._16_4_;
                              auVar92._20_4_ = auVar133._20_4_ + local_2ea0._20_4_;
                              auVar92._24_4_ = auVar133._24_4_ + local_2ea0._24_4_;
                              auVar92._28_4_ = auVar133._28_4_ + local_2ea0._28_4_;
                              auVar121._0_4_ = local_2d60._0_4_ + auVar134._0_4_;
                              auVar121._4_4_ = local_2d60._4_4_ + auVar134._4_4_;
                              auVar121._8_4_ = local_2d60._8_4_ + auVar134._8_4_;
                              auVar121._12_4_ = local_2d60._12_4_ + auVar134._12_4_;
                              auVar121._16_4_ = local_2d60._16_4_ + auVar134._16_4_;
                              auVar121._20_4_ = local_2d60._20_4_ + auVar134._20_4_;
                              auVar121._24_4_ = local_2d60._24_4_ + auVar134._24_4_;
                              auVar121._28_4_ = local_2d60._28_4_ + auVar134._28_4_;
                              fVar79 = local_2680._0_4_;
                              auVar181._0_4_ = auVar147._0_4_ + fVar79;
                              fVar10 = local_2680._4_4_;
                              auVar181._4_4_ = auVar147._4_4_ + fVar10;
                              fVar11 = local_2680._8_4_;
                              auVar181._8_4_ = auVar147._8_4_ + fVar11;
                              fVar12 = local_2680._12_4_;
                              auVar181._12_4_ = auVar147._12_4_ + fVar12;
                              fVar13 = local_2680._16_4_;
                              auVar181._16_4_ = auVar147._16_4_ + fVar13;
                              fVar14 = local_2680._20_4_;
                              auVar181._20_4_ = auVar147._20_4_ + fVar14;
                              fVar15 = local_2680._24_4_;
                              auVar181._24_4_ = auVar147._24_4_ + fVar15;
                              auVar181._28_4_ = auVar147._28_4_ + local_2680._28_4_;
                              auVar35._4_4_ = local_26c0._4_4_ * auVar121._4_4_;
                              auVar35._0_4_ = local_26c0._0_4_ * auVar121._0_4_;
                              auVar35._8_4_ = local_26c0._8_4_ * auVar121._8_4_;
                              auVar35._12_4_ = local_26c0._12_4_ * auVar121._12_4_;
                              auVar35._16_4_ = local_26c0._16_4_ * auVar121._16_4_;
                              auVar35._20_4_ = local_26c0._20_4_ * auVar121._20_4_;
                              auVar35._24_4_ = local_26c0._24_4_ * auVar121._24_4_;
                              auVar35._28_4_ = auVar80._12_4_;
                              auVar95 = vfmsub231ps_fma(auVar35,local_26e0,auVar181);
                              auVar36._4_4_ = local_26a0._4_4_ * auVar181._4_4_;
                              auVar36._0_4_ = local_26a0._0_4_ * auVar181._0_4_;
                              auVar36._8_4_ = local_26a0._8_4_ * auVar181._8_4_;
                              auVar36._12_4_ = local_26a0._12_4_ * auVar181._12_4_;
                              auVar36._16_4_ = local_26a0._16_4_ * auVar181._16_4_;
                              auVar36._20_4_ = local_26a0._20_4_ * auVar181._20_4_;
                              auVar36._24_4_ = local_26a0._24_4_ * auVar181._24_4_;
                              auVar36._28_4_ = auVar181._28_4_;
                              auVar80 = vfmsub231ps_fma(auVar36,local_26c0,auVar92);
                              auVar37._4_4_ = local_26e0._4_4_ * auVar92._4_4_;
                              auVar37._0_4_ = local_26e0._0_4_ * auVar92._0_4_;
                              auVar37._8_4_ = local_26e0._8_4_ * auVar92._8_4_;
                              auVar37._12_4_ = local_26e0._12_4_ * auVar92._12_4_;
                              auVar37._16_4_ = local_26e0._16_4_ * auVar92._16_4_;
                              auVar37._20_4_ = local_26e0._20_4_ * auVar92._20_4_;
                              auVar37._24_4_ = local_26e0._24_4_ * auVar92._24_4_;
                              auVar37._28_4_ = auVar92._28_4_;
                              auVar81 = vfmsub231ps_fma(auVar37,local_26a0,auVar121);
                              local_2ec0._4_4_ = *(undefined4 *)(local_2e40 + uVar67 + 0xc0);
                              auVar38._4_4_ = (float)local_2ec0._4_4_ * auVar81._4_4_;
                              auVar38._0_4_ = (float)local_2ec0._4_4_ * auVar81._0_4_;
                              auVar38._8_4_ = (float)local_2ec0._4_4_ * auVar81._8_4_;
                              auVar38._12_4_ = (float)local_2ec0._4_4_ * auVar81._12_4_;
                              auVar38._16_4_ = (float)local_2ec0._4_4_ * 0.0;
                              auVar38._20_4_ = (float)local_2ec0._4_4_ * 0.0;
                              auVar38._24_4_ = (float)local_2ec0._4_4_ * 0.0;
                              auVar38._28_4_ = auVar121._28_4_;
                              uVar75 = *(undefined4 *)(local_2e40 + uVar67 + 0xa0);
                              local_2f00._4_4_ = uVar75;
                              local_2f00._0_4_ = uVar75;
                              local_2f00._8_4_ = uVar75;
                              local_2f00._12_4_ = uVar75;
                              local_2f00._16_4_ = uVar75;
                              local_2f00._20_4_ = uVar75;
                              local_2f00._24_4_ = uVar75;
                              local_2f00._28_4_ = uVar75;
                              auVar80 = vfmadd231ps_fma(auVar38,local_2f00,ZEXT1632(auVar80));
                              uVar75 = *(undefined4 *)(local_2e40 + uVar67 + 0x80);
                              local_2ee0._4_4_ = uVar75;
                              local_2ee0._0_4_ = uVar75;
                              local_2ee0._8_4_ = uVar75;
                              local_2ee0._12_4_ = uVar75;
                              local_2ee0._16_4_ = uVar75;
                              local_2ee0._20_4_ = uVar75;
                              local_2ee0._24_4_ = uVar75;
                              local_2ee0._28_4_ = uVar75;
                              in_ZMM15 = ZEXT3264(local_2ee0);
                              auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),local_2ee0,
                                                        ZEXT1632(auVar95));
                              auVar128 = ZEXT1664(auVar80);
                              local_2700 = vsubps_avx(local_2d60,auVar116);
                              local_2720 = vsubps_avx(local_2680,auVar85);
                              auVar152._0_4_ = local_2d60._0_4_ + auVar116._0_4_;
                              auVar152._4_4_ = local_2d60._4_4_ + auVar116._4_4_;
                              auVar152._8_4_ = local_2d60._8_4_ + auVar116._8_4_;
                              auVar152._12_4_ = local_2d60._12_4_ + auVar116._12_4_;
                              auVar152._16_4_ = local_2d60._16_4_ + auVar116._16_4_;
                              auVar152._20_4_ = local_2d60._20_4_ + auVar116._20_4_;
                              auVar152._24_4_ = local_2d60._24_4_ + auVar116._24_4_;
                              auVar152._28_4_ = local_2d60._28_4_ + auVar116._28_4_;
                              auVar182._0_4_ = auVar85._0_4_ + fVar79;
                              auVar182._4_4_ = auVar85._4_4_ + fVar10;
                              auVar182._8_4_ = auVar85._8_4_ + fVar11;
                              auVar182._12_4_ = auVar85._12_4_ + fVar12;
                              auVar182._16_4_ = auVar85._16_4_ + fVar13;
                              auVar182._20_4_ = auVar85._20_4_ + fVar14;
                              auVar182._24_4_ = auVar85._24_4_ + fVar15;
                              fVar194 = auVar85._28_4_;
                              auVar182._28_4_ = fVar194 + local_2680._28_4_;
                              in_ZMM14 = ZEXT3264(auVar85);
                              fVar94 = local_2720._0_4_;
                              fVar108 = local_2720._4_4_;
                              auVar39._4_4_ = auVar152._4_4_ * fVar108;
                              auVar39._0_4_ = auVar152._0_4_ * fVar94;
                              fVar110 = local_2720._8_4_;
                              auVar39._8_4_ = auVar152._8_4_ * fVar110;
                              fVar112 = local_2720._12_4_;
                              auVar39._12_4_ = auVar152._12_4_ * fVar112;
                              fVar17 = local_2720._16_4_;
                              auVar39._16_4_ = auVar152._16_4_ * fVar17;
                              fVar19 = local_2720._20_4_;
                              auVar39._20_4_ = auVar152._20_4_ * fVar19;
                              fVar21 = local_2720._24_4_;
                              auVar39._24_4_ = auVar152._24_4_ * fVar21;
                              auVar39._28_4_ = fVar194;
                              auVar81 = vfmsub231ps_fma(auVar39,local_2700,auVar182);
                              local_2740 = vsubps_avx(local_2ea0,auVar135);
                              fVar107 = local_2740._0_4_;
                              fVar109 = local_2740._4_4_;
                              auVar40._4_4_ = auVar182._4_4_ * fVar109;
                              auVar40._0_4_ = auVar182._0_4_ * fVar107;
                              fVar111 = local_2740._8_4_;
                              auVar40._8_4_ = auVar182._8_4_ * fVar111;
                              fVar16 = local_2740._12_4_;
                              auVar40._12_4_ = auVar182._12_4_ * fVar16;
                              fVar18 = local_2740._16_4_;
                              auVar40._16_4_ = auVar182._16_4_ * fVar18;
                              fVar20 = local_2740._20_4_;
                              auVar40._20_4_ = auVar182._20_4_ * fVar20;
                              fVar22 = local_2740._24_4_;
                              auVar40._24_4_ = auVar182._24_4_ * fVar22;
                              auVar40._28_4_ = local_26c0._28_4_;
                              auVar183._0_4_ = auVar135._0_4_ + local_2ea0._0_4_;
                              auVar183._4_4_ = auVar135._4_4_ + local_2ea0._4_4_;
                              auVar183._8_4_ = auVar135._8_4_ + local_2ea0._8_4_;
                              auVar183._12_4_ = auVar135._12_4_ + local_2ea0._12_4_;
                              auVar183._16_4_ = auVar135._16_4_ + local_2ea0._16_4_;
                              auVar183._20_4_ = auVar135._20_4_ + local_2ea0._20_4_;
                              auVar183._24_4_ = auVar135._24_4_ + local_2ea0._24_4_;
                              auVar183._28_4_ = auVar135._28_4_ + local_2ea0._28_4_;
                              auVar95 = vfmsub231ps_fma(auVar40,local_2720,auVar183);
                              fVar219 = local_2700._0_4_;
                              fVar221 = local_2700._4_4_;
                              auVar41._4_4_ = fVar221 * auVar183._4_4_;
                              auVar41._0_4_ = fVar219 * auVar183._0_4_;
                              fVar222 = local_2700._8_4_;
                              auVar41._8_4_ = fVar222 * auVar183._8_4_;
                              fVar223 = local_2700._12_4_;
                              auVar41._12_4_ = fVar223 * auVar183._12_4_;
                              fVar224 = local_2700._16_4_;
                              auVar41._16_4_ = fVar224 * auVar183._16_4_;
                              fVar225 = local_2700._20_4_;
                              auVar41._20_4_ = fVar225 * auVar183._20_4_;
                              fVar226 = local_2700._24_4_;
                              auVar41._24_4_ = fVar226 * auVar183._24_4_;
                              auVar41._28_4_ = auVar183._28_4_;
                              auVar82 = vfmsub231ps_fma(auVar41,local_2740,auVar152);
                              auVar184._0_4_ = (float)local_2ec0._4_4_ * auVar82._0_4_;
                              auVar184._4_4_ = (float)local_2ec0._4_4_ * auVar82._4_4_;
                              auVar184._8_4_ = (float)local_2ec0._4_4_ * auVar82._8_4_;
                              auVar184._12_4_ = (float)local_2ec0._4_4_ * auVar82._12_4_;
                              auVar184._16_4_ = (float)local_2ec0._4_4_ * 0.0;
                              auVar184._20_4_ = (float)local_2ec0._4_4_ * 0.0;
                              auVar184._24_4_ = (float)local_2ec0._4_4_ * 0.0;
                              auVar184._28_4_ = 0;
                              auVar95 = vfmadd231ps_fma(auVar184,local_2f00,ZEXT1632(auVar95));
                              auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),local_2ee0,
                                                        ZEXT1632(auVar81));
                              auVar176 = vsubps_avx(auVar135,auVar133);
                              auVar153._0_4_ = auVar135._0_4_ + auVar133._0_4_;
                              auVar153._4_4_ = auVar135._4_4_ + auVar133._4_4_;
                              auVar153._8_4_ = auVar135._8_4_ + auVar133._8_4_;
                              auVar153._12_4_ = auVar135._12_4_ + auVar133._12_4_;
                              auVar153._16_4_ = auVar135._16_4_ + auVar133._16_4_;
                              auVar153._20_4_ = auVar135._20_4_ + auVar133._20_4_;
                              auVar153._24_4_ = auVar135._24_4_ + auVar133._24_4_;
                              auVar153._28_4_ = auVar135._28_4_ + auVar133._28_4_;
                              auVar133 = vsubps_avx(auVar116,auVar134);
                              auVar191._0_4_ = auVar116._0_4_ + auVar134._0_4_;
                              auVar191._4_4_ = auVar116._4_4_ + auVar134._4_4_;
                              auVar191._8_4_ = auVar116._8_4_ + auVar134._8_4_;
                              auVar191._12_4_ = auVar116._12_4_ + auVar134._12_4_;
                              auVar191._16_4_ = auVar116._16_4_ + auVar134._16_4_;
                              auVar191._20_4_ = auVar116._20_4_ + auVar134._20_4_;
                              auVar191._24_4_ = auVar116._24_4_ + auVar134._24_4_;
                              auVar191._28_4_ = auVar116._28_4_ + auVar134._28_4_;
                              auVar134 = vsubps_avx(auVar85,auVar147);
                              auVar141._0_4_ = auVar85._0_4_ + auVar147._0_4_;
                              auVar141._4_4_ = auVar85._4_4_ + auVar147._4_4_;
                              auVar141._8_4_ = auVar85._8_4_ + auVar147._8_4_;
                              auVar141._12_4_ = auVar85._12_4_ + auVar147._12_4_;
                              auVar141._16_4_ = auVar85._16_4_ + auVar147._16_4_;
                              auVar141._20_4_ = auVar85._20_4_ + auVar147._20_4_;
                              auVar141._24_4_ = auVar85._24_4_ + auVar147._24_4_;
                              auVar141._28_4_ = fVar194 + auVar147._28_4_;
                              auVar199._0_4_ = auVar191._0_4_ * auVar134._0_4_;
                              auVar199._4_4_ = auVar191._4_4_ * auVar134._4_4_;
                              auVar199._8_4_ = auVar191._8_4_ * auVar134._8_4_;
                              auVar199._12_4_ = auVar191._12_4_ * auVar134._12_4_;
                              auVar199._16_4_ = auVar191._16_4_ * auVar134._16_4_;
                              auVar199._20_4_ = auVar191._20_4_ * auVar134._20_4_;
                              auVar199._24_4_ = auVar191._24_4_ * auVar134._24_4_;
                              auVar199._28_4_ = 0;
                              auVar82 = vfmsub231ps_fma(auVar199,auVar133,auVar141);
                              auVar42._4_4_ = auVar141._4_4_ * auVar176._4_4_;
                              auVar42._0_4_ = auVar141._0_4_ * auVar176._0_4_;
                              auVar42._8_4_ = auVar141._8_4_ * auVar176._8_4_;
                              auVar42._12_4_ = auVar141._12_4_ * auVar176._12_4_;
                              auVar42._16_4_ = auVar141._16_4_ * auVar176._16_4_;
                              auVar42._20_4_ = auVar141._20_4_ * auVar176._20_4_;
                              auVar42._24_4_ = auVar141._24_4_ * auVar176._24_4_;
                              auVar42._28_4_ = auVar141._28_4_;
                              auVar81 = vfmsub231ps_fma(auVar42,auVar134,auVar153);
                              auVar43._4_4_ = auVar153._4_4_ * auVar133._4_4_;
                              auVar43._0_4_ = auVar153._0_4_ * auVar133._0_4_;
                              auVar43._8_4_ = auVar153._8_4_ * auVar133._8_4_;
                              auVar43._12_4_ = auVar153._12_4_ * auVar133._12_4_;
                              auVar43._16_4_ = auVar153._16_4_ * auVar133._16_4_;
                              auVar43._20_4_ = auVar153._20_4_ * auVar133._20_4_;
                              auVar43._24_4_ = auVar153._24_4_ * auVar133._24_4_;
                              auVar43._28_4_ = auVar153._28_4_;
                              auVar96 = vfmsub231ps_fma(auVar43,auVar176,auVar191);
                              local_2ec0._0_4_ = local_2ec0._4_4_;
                              fStack_2eb8 = (float)local_2ec0._4_4_;
                              fStack_2eb4 = (float)local_2ec0._4_4_;
                              fStack_2eb0 = (float)local_2ec0._4_4_;
                              fStack_2eac = (float)local_2ec0._4_4_;
                              fStack_2ea8 = (float)local_2ec0._4_4_;
                              fStack_2ea4 = (float)local_2ec0._4_4_;
                              auVar154._0_4_ = (float)local_2ec0._4_4_ * auVar96._0_4_;
                              auVar154._4_4_ = (float)local_2ec0._4_4_ * auVar96._4_4_;
                              auVar154._8_4_ = (float)local_2ec0._4_4_ * auVar96._8_4_;
                              auVar154._12_4_ = (float)local_2ec0._4_4_ * auVar96._12_4_;
                              auVar154._16_4_ = (float)local_2ec0._4_4_ * 0.0;
                              auVar154._20_4_ = (float)local_2ec0._4_4_ * 0.0;
                              auVar154._24_4_ = (float)local_2ec0._4_4_ * 0.0;
                              auVar154._28_4_ = 0;
                              auVar81 = vfmadd231ps_fma(auVar154,local_2f00,ZEXT1632(auVar81));
                              auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),local_2ee0,
                                                        ZEXT1632(auVar82));
                              fVar206 = auVar81._0_4_ + auVar80._0_4_ + auVar95._0_4_;
                              fVar213 = auVar81._4_4_ + auVar80._4_4_ + auVar95._4_4_;
                              fVar214 = auVar81._8_4_ + auVar80._8_4_ + auVar95._8_4_;
                              fVar215 = auVar81._12_4_ + auVar80._12_4_ + auVar95._12_4_;
                              local_2dc0 = ZEXT1632(CONCAT412(fVar215,CONCAT48(fVar214,CONCAT44(
                                                  fVar213,fVar206))));
                              local_2de0 = ZEXT1632(auVar80);
                              auVar135 = vminps_avx(local_2de0,ZEXT1632(auVar95));
                              auVar135 = vminps_avx(auVar135,ZEXT1632(auVar81));
                              local_2760 = vandps_avx(local_2dc0,local_2d00);
                              fVar194 = local_2760._0_4_ * 1.1920929e-07;
                              fVar200 = local_2760._4_4_ * 1.1920929e-07;
                              auVar44._4_4_ = fVar200;
                              auVar44._0_4_ = fVar194;
                              fVar201 = local_2760._8_4_ * 1.1920929e-07;
                              auVar44._8_4_ = fVar201;
                              fVar202 = local_2760._12_4_ * 1.1920929e-07;
                              auVar44._12_4_ = fVar202;
                              fVar203 = local_2760._16_4_ * 1.1920929e-07;
                              auVar44._16_4_ = fVar203;
                              fVar204 = local_2760._20_4_ * 1.1920929e-07;
                              auVar44._20_4_ = fVar204;
                              fVar205 = local_2760._24_4_ * 1.1920929e-07;
                              auVar44._24_4_ = fVar205;
                              auVar44._28_4_ = 0x34000000;
                              auVar192._0_8_ = CONCAT44(fVar200,fVar194) ^ 0x8000000080000000;
                              auVar192._8_4_ = -fVar201;
                              auVar192._12_4_ = -fVar202;
                              auVar192._16_4_ = -fVar203;
                              auVar192._20_4_ = -fVar204;
                              auVar192._24_4_ = -fVar205;
                              auVar192._28_4_ = 0xb4000000;
                              auVar135 = vcmpps_avx(auVar135,auVar192,5);
                              auVar147 = ZEXT1632(auVar95);
                              auVar116 = vmaxps_avx(local_2de0,auVar147);
                              auVar116 = vmaxps_avx(auVar116,ZEXT1632(auVar81));
                              auVar116 = vcmpps_avx(auVar116,auVar44,2);
                              auVar135 = vorps_avx(auVar135,auVar116);
                              if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0 ||
                                       (auVar135 >> 0x3f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar135 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar135 >> 0x7f,0) != '\0')
                                    || (auVar135 & (undefined1  [32])0x100000000) !=
                                       (undefined1  [32])0x0) || SUB321(auVar135 >> 0xbf,0) != '\0')
                                  || (auVar135 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0) || auVar135[0x1f] < '\0') {
                                auVar45._4_4_ = fVar221 * local_26c0._4_4_;
                                auVar45._0_4_ = fVar219 * local_26c0._0_4_;
                                auVar45._8_4_ = fVar222 * local_26c0._8_4_;
                                auVar45._12_4_ = fVar223 * local_26c0._12_4_;
                                auVar45._16_4_ = fVar224 * local_26c0._16_4_;
                                auVar45._20_4_ = fVar225 * local_26c0._20_4_;
                                auVar45._24_4_ = fVar226 * local_26c0._24_4_;
                                auVar45._28_4_ = auVar116._28_4_;
                                in_ZMM14 = ZEXT3264(local_2740);
                                auVar122._0_4_ = fVar107 * local_26e0._0_4_;
                                auVar122._4_4_ = fVar109 * local_26e0._4_4_;
                                auVar122._8_4_ = fVar111 * local_26e0._8_4_;
                                auVar122._12_4_ = fVar16 * local_26e0._12_4_;
                                auVar122._16_4_ = fVar18 * local_26e0._16_4_;
                                auVar122._20_4_ = fVar20 * local_26e0._20_4_;
                                auVar122._24_4_ = fVar22 * local_26e0._24_4_;
                                auVar122._28_4_ = 0;
                                auVar128 = ZEXT3264(auVar122);
                                in_ZMM15 = ZEXT3264(local_2720);
                                auVar80 = vfmsub213ps_fma(local_26e0,local_2720,auVar45);
                                auVar46._4_4_ = fVar108 * auVar133._4_4_;
                                auVar46._0_4_ = fVar94 * auVar133._0_4_;
                                auVar46._8_4_ = fVar110 * auVar133._8_4_;
                                auVar46._12_4_ = fVar112 * auVar133._12_4_;
                                auVar46._16_4_ = fVar17 * auVar133._16_4_;
                                auVar46._20_4_ = fVar19 * auVar133._20_4_;
                                auVar46._24_4_ = fVar21 * auVar133._24_4_;
                                auVar46._28_4_ = 0x34000000;
                                auVar47._4_4_ = fVar109 * auVar134._4_4_;
                                auVar47._0_4_ = fVar107 * auVar134._0_4_;
                                auVar47._8_4_ = fVar111 * auVar134._8_4_;
                                auVar47._12_4_ = fVar16 * auVar134._12_4_;
                                auVar47._16_4_ = fVar18 * auVar134._16_4_;
                                auVar47._20_4_ = fVar20 * auVar134._20_4_;
                                auVar47._24_4_ = fVar22 * auVar134._24_4_;
                                auVar47._28_4_ = local_2760._28_4_;
                                auVar95 = vfmsub213ps_fma(auVar134,local_2700,auVar46);
                                auVar116 = vandps_avx(local_2d00,auVar45);
                                auVar85 = vandps_avx(auVar46,local_2d00);
                                auVar116 = vcmpps_avx(auVar116,auVar85,1);
                                auVar134 = vblendvps_avx(ZEXT1632(auVar95),ZEXT1632(auVar80),
                                                         auVar116);
                                auVar48._4_4_ = fVar221 * auVar176._4_4_;
                                auVar48._0_4_ = fVar219 * auVar176._0_4_;
                                auVar48._8_4_ = fVar222 * auVar176._8_4_;
                                auVar48._12_4_ = fVar223 * auVar176._12_4_;
                                auVar48._16_4_ = fVar224 * auVar176._16_4_;
                                auVar48._20_4_ = fVar225 * auVar176._20_4_;
                                auVar48._24_4_ = fVar226 * auVar176._24_4_;
                                auVar48._28_4_ = auVar116._28_4_;
                                auVar80 = vfmsub213ps_fma(auVar176,local_2720,auVar47);
                                auVar172._0_4_ = local_26a0._0_4_ * fVar94;
                                auVar172._4_4_ = local_26a0._4_4_ * fVar108;
                                auVar172._8_4_ = local_26a0._8_4_ * fVar110;
                                auVar172._12_4_ = local_26a0._12_4_ * fVar112;
                                auVar172._16_4_ = local_26a0._16_4_ * fVar17;
                                auVar172._20_4_ = local_26a0._20_4_ * fVar19;
                                auVar172._24_4_ = local_26a0._24_4_ * fVar21;
                                auVar172._28_4_ = 0;
                                auVar95 = vfmsub213ps_fma(local_26c0,local_2740,auVar172);
                                auVar116 = vandps_avx(local_2d00,auVar172);
                                auVar85 = vandps_avx(auVar47,local_2d00);
                                auVar116 = vcmpps_avx(auVar116,auVar85,1);
                                auVar176 = vblendvps_avx(ZEXT1632(auVar80),ZEXT1632(auVar95),
                                                         auVar116);
                                auVar80 = vfmsub213ps_fma(local_26a0,local_2700,auVar122);
                                auVar95 = vfmsub213ps_fma(auVar133,local_2740,auVar48);
                                auVar116 = vandps_avx(local_2d00,auVar122);
                                auVar85 = vandps_avx(local_2d00,auVar48);
                                auVar116 = vcmpps_avx(auVar116,auVar85,1);
                                auVar116 = vblendvps_avx(ZEXT1632(auVar95),ZEXT1632(auVar80),
                                                         auVar116);
                                auVar80 = vpackssdw_avx(auVar135._0_16_,auVar135._16_16_);
                                fVar94 = auVar116._0_4_;
                                fVar107 = auVar116._4_4_;
                                auVar49._4_4_ = fVar107 * (float)local_2ec0._4_4_;
                                auVar49._0_4_ = fVar94 * (float)local_2ec0._4_4_;
                                fVar108 = auVar116._8_4_;
                                auVar49._8_4_ = fVar108 * (float)local_2ec0._4_4_;
                                fVar109 = auVar116._12_4_;
                                auVar49._12_4_ = fVar109 * (float)local_2ec0._4_4_;
                                fVar110 = auVar116._16_4_;
                                auVar49._16_4_ = fVar110 * (float)local_2ec0._4_4_;
                                fVar111 = auVar116._20_4_;
                                auVar49._20_4_ = fVar111 * (float)local_2ec0._4_4_;
                                fVar112 = auVar116._24_4_;
                                auVar49._24_4_ = fVar112 * (float)local_2ec0._4_4_;
                                auVar49._28_4_ = auVar134._28_4_;
                                auVar95 = vfmadd213ps_fma(local_2f00,auVar176,auVar49);
                                auVar95 = vfmadd213ps_fma(local_2ee0,auVar134,ZEXT1632(auVar95));
                                auVar142 = ZEXT1632(CONCAT412(auVar95._12_4_ + auVar95._12_4_,
                                                              CONCAT48(auVar95._8_4_ + auVar95._8_4_
                                                                       ,CONCAT44(auVar95._4_4_ +
                                                                                 auVar95._4_4_,
                                                                                 auVar95._0_4_ +
                                                                                 auVar95._0_4_))));
                                auVar155._0_4_ = fVar94 * fVar79;
                                auVar155._4_4_ = fVar107 * fVar10;
                                auVar155._8_4_ = fVar108 * fVar11;
                                auVar155._12_4_ = fVar109 * fVar12;
                                auVar155._16_4_ = fVar110 * fVar13;
                                auVar155._20_4_ = fVar111 * fVar14;
                                auVar155._24_4_ = fVar112 * fVar15;
                                auVar155._28_4_ = 0;
                                auVar95 = vfmadd213ps_fma(local_2d60,auVar176,auVar155);
                                auVar81 = vfmadd213ps_fma(local_2ea0,auVar134,ZEXT1632(auVar95));
                                auVar135 = vrcpps_avx(auVar142);
                                auVar211._8_4_ = 0x3f800000;
                                auVar211._0_8_ = 0x3f8000003f800000;
                                auVar211._12_4_ = 0x3f800000;
                                auVar211._16_4_ = 0x3f800000;
                                auVar211._20_4_ = 0x3f800000;
                                auVar211._24_4_ = 0x3f800000;
                                auVar211._28_4_ = 0x3f800000;
                                auVar95 = vfnmadd213ps_fma(auVar135,auVar142,auVar211);
                                auVar95 = vfmadd132ps_fma(ZEXT1632(auVar95),auVar135,auVar135);
                                auVar133 = ZEXT1632(CONCAT412(auVar95._12_4_ *
                                                              (auVar81._12_4_ + auVar81._12_4_),
                                                              CONCAT48(auVar95._8_4_ *
                                                                       (auVar81._8_4_ +
                                                                       auVar81._8_4_),
                                                                       CONCAT44(auVar95._4_4_ *
                                                                                (auVar81._4_4_ +
                                                                                auVar81._4_4_),
                                                                                auVar95._0_4_ *
                                                                                (auVar81._0_4_ +
                                                                                auVar81._0_4_)))));
                                uVar75 = *(undefined4 *)(local_2e40 + sVar69 * 4 + 0x60);
                                auVar193._4_4_ = uVar75;
                                auVar193._0_4_ = uVar75;
                                auVar193._8_4_ = uVar75;
                                auVar193._12_4_ = uVar75;
                                auVar193._16_4_ = uVar75;
                                auVar193._20_4_ = uVar75;
                                auVar193._24_4_ = uVar75;
                                auVar193._28_4_ = uVar75;
                                uVar75 = *(undefined4 *)(local_2e40 + sVar69 * 4 + 0x100);
                                auVar212._4_4_ = uVar75;
                                auVar212._0_4_ = uVar75;
                                auVar212._8_4_ = uVar75;
                                auVar212._12_4_ = uVar75;
                                auVar212._16_4_ = uVar75;
                                auVar212._20_4_ = uVar75;
                                auVar212._24_4_ = uVar75;
                                auVar212._28_4_ = uVar75;
                                auVar106 = ZEXT3264(auVar212);
                                auVar135 = vcmpps_avx(auVar193,auVar133,2);
                                auVar116 = vcmpps_avx(auVar133,auVar212,2);
                                auVar135 = vandps_avx(auVar116,auVar135);
                                auVar95 = vpackssdw_avx(auVar135._0_16_,auVar135._16_16_);
                                auVar80 = vpand_avx(auVar95,auVar80);
                                auVar135 = vpmovsxwd_avx2(auVar80);
                                auVar85 = local_2dc0;
                                if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (auVar135 >> 0x3f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar135 >> 0x5f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) || SUB321(auVar135 >> 0x7f,0) != '\0'
                                       ) || (auVar135 & (undefined1  [32])0x100000000) !=
                                            (undefined1  [32])0x0) ||
                                     SUB321(auVar135 >> 0xbf,0) != '\0') ||
                                    (auVar135 & (undefined1  [32])0x100000000) !=
                                    (undefined1  [32])0x0) || auVar135[0x1f] < '\0') {
                                  auVar135 = vcmpps_avx(auVar142,_DAT_01faff00,4);
                                  auVar95 = vpackssdw_avx(auVar135._0_16_,auVar135._16_16_);
                                  auVar80 = vpand_avx(auVar80,auVar95);
                                  auVar135 = vpmovsxwd_avx2(auVar80);
                                  if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0 ||
                                           (auVar135 >> 0x3f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar135 >> 0x5f & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         SUB321(auVar135 >> 0x7f,0) != '\0') ||
                                        (auVar135 & (undefined1  [32])0x100000000) !=
                                        (undefined1  [32])0x0) || SUB321(auVar135 >> 0xbf,0) != '\0'
                                       ) || (auVar135 & (undefined1  [32])0x100000000) !=
                                            (undefined1  [32])0x0) || auVar135[0x1f] < '\0') {
                                    local_2ac0 = local_2dc0;
                                    local_2aa0 = &local_2f39;
                                    local_2a80 = auVar135;
                                    local_2a20 = auVar133;
                                    auVar135 = vsubps_avx(local_2dc0,auVar147);
                                    local_2b00 = vblendvps_avx(local_2de0,auVar135,local_2780);
                                    auVar135 = vsubps_avx(local_2dc0,local_2de0);
                                    local_2ae0 = vblendvps_avx(auVar147,auVar135,local_2780);
                                    auVar128 = ZEXT3264(local_2ae0);
                                    fVar79 = local_27a0._0_4_;
                                    fVar10 = local_27a0._4_4_;
                                    local_2a00._4_4_ = auVar134._4_4_ * fVar10;
                                    local_2a00._0_4_ = auVar134._0_4_ * fVar79;
                                    fVar11 = local_27a0._8_4_;
                                    local_2a00._8_4_ = auVar134._8_4_ * fVar11;
                                    fVar12 = local_27a0._12_4_;
                                    local_2a00._12_4_ = auVar134._12_4_ * fVar12;
                                    fVar13 = local_27a0._16_4_;
                                    local_2a00._16_4_ = auVar134._16_4_ * fVar13;
                                    fVar14 = local_27a0._20_4_;
                                    local_2a00._20_4_ = auVar134._20_4_ * fVar14;
                                    fVar15 = local_27a0._24_4_;
                                    local_2a00._24_4_ = auVar134._24_4_ * fVar15;
                                    local_2a00._28_4_ = local_2780._28_4_;
                                    local_29e0[0] = fVar79 * auVar176._0_4_;
                                    local_29e0[1] = fVar10 * auVar176._4_4_;
                                    local_29e0[2] = fVar11 * auVar176._8_4_;
                                    local_29e0[3] = fVar12 * auVar176._12_4_;
                                    fStack_29d0 = fVar13 * auVar176._16_4_;
                                    fStack_29cc = fVar14 * auVar176._20_4_;
                                    fStack_29c8 = fVar15 * auVar176._24_4_;
                                    uStack_29c4 = auVar176._28_4_;
                                    local_29c0[0] = fVar79 * fVar94;
                                    local_29c0[1] = fVar10 * fVar107;
                                    local_29c0[2] = fVar11 * fVar108;
                                    local_29c0[3] = fVar12 * fVar109;
                                    fStack_29b0 = fVar13 * fVar110;
                                    fStack_29ac = fVar14 * fVar111;
                                    fStack_29a8 = fVar15 * fVar112;
                                    uStack_29a4 = auVar176._28_4_;
                                    pGVar5 = (local_2e08->geometries).items[local_2e20].ptr;
                                    if ((pGVar5->mask & *(uint *)(local_2e40 + sVar69 * 4 + 0x120))
                                        != 0) {
                                      if ((local_2e38->args->filter == (RTCFilterFunctionN)0x0) &&
                                         (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00553e27:
                                        *(undefined4 *)(local_2ce0 + sVar69 * 4) = 0;
                                        auVar85 = local_2dc0;
                                      }
                                      else {
                                        auVar84._0_4_ =
                                             (float)(int)(*(ushort *)(local_2e10 + 8 + local_2e18) -
                                                         1);
                                        auVar84._4_12_ = local_2700._4_12_;
                                        auVar95 = vrcpss_avx(auVar84,auVar84);
                                        auVar161._0_4_ =
                                             (float)(int)(*(ushort *)(local_2e10 + 10 + local_2e18)
                                                         - 1);
                                        auVar161._4_12_ = local_2700._4_12_;
                                        auVar81 = vfnmadd213ss_fma(auVar84,auVar95,
                                                                   SUB6416(ZEXT464(0x40000000),0));
                                        fVar79 = auVar95._0_4_ * auVar81._0_4_;
                                        auVar95 = vrcpss_avx(auVar161,auVar161);
                                        auVar81 = vfnmadd213ss_fma(auVar161,auVar95,
                                                                   SUB6416(ZEXT464(0x40000000),0));
                                        fVar10 = auVar95._0_4_ * auVar81._0_4_;
                                        auVar135 = vrcpps_avx(local_2dc0);
                                        auVar156._8_4_ = 0x3f800000;
                                        auVar156._0_8_ = 0x3f8000003f800000;
                                        auVar156._12_4_ = 0x3f800000;
                                        auVar156._16_4_ = 0x3f800000;
                                        auVar156._20_4_ = 0x3f800000;
                                        auVar156._24_4_ = 0x3f800000;
                                        auVar156._28_4_ = 0x3f800000;
                                        auVar95 = vfnmadd213ps_fma(local_2dc0,auVar135,auVar156);
                                        auVar95 = vfmadd132ps_fma(ZEXT1632(auVar95),auVar135,
                                                                  auVar135);
                                        auVar123._8_4_ = 0x219392ef;
                                        auVar123._0_8_ = 0x219392ef219392ef;
                                        auVar123._12_4_ = 0x219392ef;
                                        auVar123._16_4_ = 0x219392ef;
                                        auVar123._20_4_ = 0x219392ef;
                                        auVar123._24_4_ = 0x219392ef;
                                        auVar123._28_4_ = 0x219392ef;
                                        auVar135 = vcmpps_avx(local_2760,auVar123,5);
                                        auVar135 = vandps_avx(ZEXT1632(auVar95),auVar135);
                                        auVar128 = ZEXT3264(auVar135);
                                        auVar50._4_4_ =
                                             (fVar213 * (float)local_2840._4_4_ + local_2b00._4_4_)
                                             * fVar79 * auVar135._4_4_;
                                        auVar50._0_4_ =
                                             (fVar206 * (float)local_2840._0_4_ + local_2b00._0_4_)
                                             * fVar79 * auVar135._0_4_;
                                        auVar50._8_4_ =
                                             (fVar214 * fStack_2838 + local_2b00._8_4_) * fVar79 *
                                             auVar135._8_4_;
                                        auVar50._12_4_ =
                                             (fVar215 * fStack_2834 + local_2b00._12_4_) * fVar79 *
                                             auVar135._12_4_;
                                        auVar50._16_4_ =
                                             (fStack_2830 * 0.0 + local_2b00._16_4_) * fVar79 *
                                             auVar135._16_4_;
                                        auVar50._20_4_ =
                                             (fStack_282c * 0.0 + local_2b00._20_4_) * fVar79 *
                                             auVar135._20_4_;
                                        auVar50._24_4_ =
                                             (fStack_2828 * 0.0 + local_2b00._24_4_) * fVar79 *
                                             auVar135._24_4_;
                                        auVar50._28_4_ = fVar79;
                                        local_2a60 = vminps_avx(auVar50,auVar156);
                                        auVar51._4_4_ =
                                             (fVar213 * (float)local_2860._4_4_ + local_2ae0._4_4_)
                                             * fVar10 * auVar135._4_4_;
                                        auVar51._0_4_ =
                                             (fVar206 * (float)local_2860._0_4_ + local_2ae0._0_4_)
                                             * fVar10 * auVar135._0_4_;
                                        auVar51._8_4_ =
                                             (fVar214 * fStack_2858 + local_2ae0._8_4_) * fVar10 *
                                             auVar135._8_4_;
                                        auVar51._12_4_ =
                                             (fVar215 * fStack_2854 + local_2ae0._12_4_) * fVar10 *
                                             auVar135._12_4_;
                                        auVar51._16_4_ =
                                             (fStack_2850 * 0.0 + local_2ae0._16_4_) * fVar10 *
                                             auVar135._16_4_;
                                        auVar51._20_4_ =
                                             (fStack_284c * 0.0 + local_2ae0._20_4_) * fVar10 *
                                             auVar135._20_4_;
                                        auVar51._24_4_ =
                                             (fStack_2848 * 0.0 + local_2ae0._24_4_) * fVar10 *
                                             auVar135._24_4_;
                                        auVar51._28_4_ = local_2a60._28_4_;
                                        local_2a40 = vminps_avx(auVar51,auVar156);
                                        if ((((((((((((((((auVar80 >> 7 & (undefined1  [16])0x1) !=
                                                          (undefined1  [16])0x0 ||
                                                         (auVar80 >> 0xf & (undefined1  [16])0x1) !=
                                                         (undefined1  [16])0x0) ||
                                                        (auVar80 >> 0x17 & (undefined1  [16])0x1) !=
                                                        (undefined1  [16])0x0) ||
                                                       (auVar80 >> 0x1f & (undefined1  [16])0x1) !=
                                                       (undefined1  [16])0x0) ||
                                                      (auVar80 >> 0x27 & (undefined1  [16])0x1) !=
                                                      (undefined1  [16])0x0) ||
                                                     (auVar80 >> 0x2f & (undefined1  [16])0x1) !=
                                                     (undefined1  [16])0x0) ||
                                                    (auVar80 >> 0x37 & (undefined1  [16])0x1) !=
                                                    (undefined1  [16])0x0) ||
                                                   (auVar80 >> 0x3f & (undefined1  [16])0x1) !=
                                                   (undefined1  [16])0x0) ||
                                                  (auVar80 >> 0x47 & (undefined1  [16])0x1) !=
                                                  (undefined1  [16])0x0) ||
                                                 (auVar80 >> 0x4f & (undefined1  [16])0x1) !=
                                                 (undefined1  [16])0x0) ||
                                                (auVar80 >> 0x57 & (undefined1  [16])0x1) !=
                                                (undefined1  [16])0x0) ||
                                               (auVar80 >> 0x5f & (undefined1  [16])0x1) !=
                                               (undefined1  [16])0x0) ||
                                              (auVar80 >> 0x67 & (undefined1  [16])0x1) !=
                                              (undefined1  [16])0x0) ||
                                             (auVar80 >> 0x6f & (undefined1  [16])0x1) !=
                                             (undefined1  [16])0x0) ||
                                            (auVar80 >> 0x77 & (undefined1  [16])0x1) !=
                                            (undefined1  [16])0x0) || auVar80[0xf] < '\0') {
                                          auVar80 = vpacksswb_avx(auVar80,auVar80);
                                          uVar70 = 0;
                                          uVar68 = (ulong)(byte)(SUB161(auVar80 >> 7,0) & 1 |
                                                                 (SUB161(auVar80 >> 0xf,0) & 1) << 1
                                                                 | (SUB161(auVar80 >> 0x17,0) & 1)
                                                                   << 2 | (SUB161(auVar80 >> 0x1f,0)
                                                                          & 1) << 3 |
                                                                 (SUB161(auVar80 >> 0x27,0) & 1) <<
                                                                 4 | (SUB161(auVar80 >> 0x2f,0) & 1)
                                                                     << 5 |
                                                                 (SUB161(auVar80 >> 0x37,0) & 1) <<
                                                                 6 | SUB161(auVar80 >> 0x3f,0) << 7)
                                          ;
                                          for (uVar67 = uVar68; (uVar67 & 1) == 0;
                                              uVar67 = uVar67 >> 1 | 0x8000000000000000) {
                                            uVar70 = uVar70 + 1;
                                          }
                                          iVar59 = 1 << ((uint)sVar69 & 0x1f);
                                          auVar93._4_4_ = iVar59;
                                          auVar93._0_4_ = iVar59;
                                          auVar93._8_4_ = iVar59;
                                          auVar93._12_4_ = iVar59;
                                          auVar93._16_4_ = iVar59;
                                          auVar93._20_4_ = iVar59;
                                          auVar93._24_4_ = iVar59;
                                          auVar93._28_4_ = iVar59;
                                          auVar116 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
                                          auVar135 = vpand_avx2(auVar93,auVar116);
                                          _local_2ec0 = vpcmpeqd_avx2(auVar135,auVar116);
                                          local_2f38 = sVar69;
                                          local_2ee0 = auVar212;
                                          do {
                                            local_2940 = *(undefined4 *)(local_2a60 + uVar70 * 4);
                                            local_2920 = *(undefined4 *)(local_2a40 + uVar70 * 4);
                                            *(undefined4 *)(ray + sVar69 * 4 + 0x100) =
                                                 *(undefined4 *)(local_2a20 + uVar70 * 4);
                                            fVar79 = local_29e0[uVar70 - 8];
                                            auVar115._4_4_ = fVar79;
                                            auVar115._0_4_ = fVar79;
                                            auVar115._8_4_ = fVar79;
                                            auVar115._12_4_ = fVar79;
                                            auVar124._16_4_ = fVar79;
                                            auVar124._0_16_ = auVar115;
                                            auVar124._20_4_ = fVar79;
                                            auVar124._24_4_ = fVar79;
                                            auVar124._28_4_ = fVar79;
                                            fVar10 = local_29e0[uVar70];
                                            local_2980._4_4_ = fVar10;
                                            local_2980._0_4_ = fVar10;
                                            local_2980._8_4_ = fVar10;
                                            local_2980._12_4_ = fVar10;
                                            local_2980._16_4_ = fVar10;
                                            local_2980._20_4_ = fVar10;
                                            local_2980._24_4_ = fVar10;
                                            local_2980._28_4_ = fVar10;
                                            fVar10 = local_29c0[uVar70];
                                            local_2960._4_4_ = fVar10;
                                            local_2960._0_4_ = fVar10;
                                            local_2960._8_4_ = fVar10;
                                            local_2960._12_4_ = fVar10;
                                            local_2960._16_4_ = fVar10;
                                            local_2960._20_4_ = fVar10;
                                            local_2960._24_4_ = fVar10;
                                            local_2960._28_4_ = fVar10;
                                            local_2d90.context = context->user;
                                            local_29a0[0] = (RTCHitN)SUB41(fVar79,0);
                                            local_29a0[1] = (RTCHitN)SUB41(fVar79,1);
                                            local_29a0[2] = (RTCHitN)SUB41(fVar79,2);
                                            local_29a0[3] = (RTCHitN)SUB41(fVar79,3);
                                            local_29a0[4] = (RTCHitN)SUB41(fVar79,0);
                                            local_29a0[5] = (RTCHitN)SUB41(fVar79,1);
                                            local_29a0[6] = (RTCHitN)SUB41(fVar79,2);
                                            local_29a0[7] = (RTCHitN)SUB41(fVar79,3);
                                            local_29a0[8] = (RTCHitN)SUB41(fVar79,0);
                                            local_29a0[9] = (RTCHitN)SUB41(fVar79,1);
                                            local_29a0[10] = (RTCHitN)SUB41(fVar79,2);
                                            local_29a0[0xb] = (RTCHitN)SUB41(fVar79,3);
                                            local_29a0[0xc] = (RTCHitN)SUB41(fVar79,0);
                                            local_29a0[0xd] = (RTCHitN)SUB41(fVar79,1);
                                            local_29a0[0xe] = (RTCHitN)SUB41(fVar79,2);
                                            local_29a0[0xf] = (RTCHitN)SUB41(fVar79,3);
                                            local_29a0[0x10] = (RTCHitN)SUB41(fVar79,0);
                                            local_29a0[0x11] = (RTCHitN)(char)((uint)fVar79 >> 8);
                                            local_29a0[0x12] = (RTCHitN)(char)((uint)fVar79 >> 0x10)
                                            ;
                                            local_29a0[0x13] = (RTCHitN)(char)((uint)fVar79 >> 0x18)
                                            ;
                                            local_29a0[0x14] = (RTCHitN)SUB41(fVar79,0);
                                            local_29a0[0x15] = (RTCHitN)(char)((uint)fVar79 >> 8);
                                            local_29a0[0x16] = (RTCHitN)(char)((uint)fVar79 >> 0x10)
                                            ;
                                            local_29a0[0x17] = (RTCHitN)(char)((uint)fVar79 >> 0x18)
                                            ;
                                            local_29a0[0x18] = (RTCHitN)SUB41(fVar79,0);
                                            local_29a0[0x19] = (RTCHitN)(char)((uint)fVar79 >> 8);
                                            local_29a0[0x1a] = (RTCHitN)(char)((uint)fVar79 >> 0x10)
                                            ;
                                            local_29a0[0x1b] = (RTCHitN)(char)((uint)fVar79 >> 0x18)
                                            ;
                                            local_29a0[0x1c] = (RTCHitN)SUB41(fVar79,0);
                                            local_29a0[0x1d] = (RTCHitN)(char)((uint)fVar79 >> 8);
                                            local_29a0[0x1e] = (RTCHitN)(char)((uint)fVar79 >> 0x10)
                                            ;
                                            local_29a0[0x1f] = (RTCHitN)(char)((uint)fVar79 >> 0x18)
                                            ;
                                            uStack_293c = local_2940;
                                            uStack_2938 = local_2940;
                                            uStack_2934 = local_2940;
                                            uStack_2930 = local_2940;
                                            uStack_292c = local_2940;
                                            uStack_2928 = local_2940;
                                            uStack_2924 = local_2940;
                                            uStack_291c = local_2920;
                                            uStack_2918 = local_2920;
                                            uStack_2914 = local_2920;
                                            uStack_2910 = local_2920;
                                            uStack_290c = local_2920;
                                            uStack_2908 = local_2920;
                                            uStack_2904 = local_2920;
                                            local_2900 = CONCAT44(uStack_27fc,local_2800);
                                            uStack_28f8 = CONCAT44(uStack_27f4,uStack_27f8);
                                            uStack_28f0 = CONCAT44(uStack_27ec,uStack_27f0);
                                            uStack_28e8 = CONCAT44(uStack_27e4,uStack_27e8);
                                            local_28e0._4_4_ = uStack_27dc;
                                            local_28e0._0_4_ = local_27e0;
                                            local_28e0._8_4_ = uStack_27d8;
                                            local_28e0._12_4_ = uStack_27d4;
                                            local_28e0._16_4_ = uStack_27d0;
                                            local_28e0._20_4_ = uStack_27cc;
                                            local_28e0._24_4_ = uStack_27c8;
                                            local_28e0._28_4_ = uStack_27c4;
                                            vpcmpeqd_avx2(local_28e0,local_28e0);
                                            local_28c0._4_4_ = (local_2d90.context)->instID[0];
                                            local_28c0._0_4_ = local_28c0._4_4_;
                                            local_28c0._8_4_ = local_28c0._4_4_;
                                            local_28c0._12_4_ = local_28c0._4_4_;
                                            local_28c0._16_4_ = local_28c0._4_4_;
                                            local_28c0._20_4_ = local_28c0._4_4_;
                                            local_28c0._24_4_ = local_28c0._4_4_;
                                            local_28c0._28_4_ = local_28c0._4_4_;
                                            local_28a0._4_4_ = (local_2d90.context)->instPrimID[0];
                                            local_28a0._0_4_ = local_28a0._4_4_;
                                            local_28a0._8_4_ = local_28a0._4_4_;
                                            local_28a0._12_4_ = local_28a0._4_4_;
                                            local_28a0._16_4_ = local_28a0._4_4_;
                                            local_28a0._20_4_ = local_28a0._4_4_;
                                            local_28a0._24_4_ = local_28a0._4_4_;
                                            local_28a0._28_4_ = local_28a0._4_4_;
                                            local_2d20 = _local_2ec0;
                                            local_2d90.valid = (int *)local_2d20;
                                            local_2d90.geometryUserPtr = pGVar5->userPtr;
                                            local_2d90.ray = (RTCRayN *)ray;
                                            local_2d90.hit = local_29a0;
                                            local_2d90.N = 8;
                                            uVar67 = uVar70;
                                            if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)
                                            {
                                              local_2f00._0_8_ = uVar70;
                                              local_2ea0._0_8_ = uVar68;
                                              auVar124 = ZEXT1632(auVar115);
                                              in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                                              in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
                                              (*pGVar5->occlusionFilterN)(&local_2d90);
                                              auVar106 = ZEXT3264(local_2ee0);
                                              uVar68 = local_2ea0._0_8_;
                                              sVar69 = local_2f38;
                                              uVar67 = local_2f00._0_8_;
                                            }
                                            auVar116 = vpcmpeqd_avx2(local_2d20,_DAT_01faff00);
                                            auVar125 = vpcmpeqd_avx2(auVar124,auVar124);
                                            auVar135 = auVar125 & ~auVar116;
                                            if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) ==
                                                      (undefined1  [32])0x0 &&
                                                     (auVar135 >> 0x3f & (undefined1  [32])0x1) ==
                                                     (undefined1  [32])0x0) &&
                                                    (auVar135 >> 0x5f & (undefined1  [32])0x1) ==
                                                    (undefined1  [32])0x0) &&
                                                   SUB321(auVar135 >> 0x7f,0) == '\0') &&
                                                  (auVar135 & (undefined1  [32])0x100000000) ==
                                                  (undefined1  [32])0x0) &&
                                                 SUB321(auVar135 >> 0xbf,0) == '\0') &&
                                                (auVar135 & (undefined1  [32])0x100000000) ==
                                                (undefined1  [32])0x0) && -1 < auVar135[0x1f]) {
                                              auVar116 = auVar116 ^ auVar125;
                                            }
                                            else {
                                              p_Var9 = context->args->filter;
                                              if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                                                 (((context->args->flags &
                                                   RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                                   RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                                  (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                                                local_2f00._0_8_ = uVar67;
                                                local_2ea0._0_8_ = uVar68;
                                                in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                                                in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
                                                (*p_Var9)(&local_2d90);
                                                auVar106 = ZEXT3264(local_2ee0);
                                                uVar68 = local_2ea0._0_8_;
                                                sVar69 = local_2f38;
                                                uVar67 = local_2f00._0_8_;
                                              }
                                              auVar135 = vpcmpeqd_avx2(local_2d20,_DAT_01faff00);
                                              auVar116 = vpcmpeqd_avx2(local_2d20,local_2d20);
                                              auVar116 = auVar135 ^ auVar116;
                                              auVar125._8_4_ = 0xff800000;
                                              auVar125._0_8_ = 0xff800000ff800000;
                                              auVar125._12_4_ = 0xff800000;
                                              auVar125._16_4_ = 0xff800000;
                                              auVar125._20_4_ = 0xff800000;
                                              auVar125._24_4_ = 0xff800000;
                                              auVar125._28_4_ = 0xff800000;
                                              auVar135 = vblendvps_avx(auVar125,*(undefined1
                                                                                  (*) [32])
                                                                                 (local_2d90.ray +
                                                                                 0x100),auVar135);
                                              *(undefined1 (*) [32])(local_2d90.ray + 0x100) =
                                                   auVar135;
                                            }
                                            auVar128 = ZEXT3264(auVar125);
                                            if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) !=
                                                      (undefined1  [32])0x0 ||
                                                     (auVar116 >> 0x3f & (undefined1  [32])0x1) !=
                                                     (undefined1  [32])0x0) ||
                                                    (auVar116 >> 0x5f & (undefined1  [32])0x1) !=
                                                    (undefined1  [32])0x0) ||
                                                   SUB321(auVar116 >> 0x7f,0) != '\0') ||
                                                  (auVar116 & (undefined1  [32])0x100000000) !=
                                                  (undefined1  [32])0x0) ||
                                                 SUB321(auVar116 >> 0xbf,0) != '\0') ||
                                                (auVar116 & (undefined1  [32])0x100000000) !=
                                                (undefined1  [32])0x0) || auVar116[0x1f] < '\0')
                                            goto LAB_00553e27;
                                            *(int *)(local_2f08 + sVar69 * 4) = auVar106._0_4_;
                                            uVar70 = 0;
                                            uVar68 = uVar68 ^ 1L << (uVar67 & 0x3f);
                                            for (uVar67 = uVar68; (uVar67 & 1) == 0;
                                                uVar67 = uVar67 >> 1 | 0x8000000000000000) {
                                              uVar70 = uVar70 + 1;
                                            }
                                            auVar85 = local_2dc0;
                                          } while (uVar68 != 0);
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                              local_2dc0 = auVar85;
                              uVar67 = local_2d40._0_8_ - 1 & local_2d40._0_8_;
                              pRVar74 = ray;
                              uVar68 = unaff_R14;
                              pRVar77 = context;
                            } while (uVar67 != 0);
                            in_ZMM13 = ZEXT3264(local_2820);
                            lVar64 = local_2e50;
                            uVar70 = local_2e48;
                            puVar72 = local_2f20;
                            pauVar73 = local_2f28;
                            auVar135 = local_27c0;
                          }
                          auVar116 = auVar135 & local_2ce0;
                          bVar78 = (((((((auVar116 >> 0x1f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0 &&
                                        (auVar116 >> 0x3f & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (auVar116 >> 0x5f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) && SUB321(auVar116 >> 0x7f,0) == '\0')
                                     && (auVar116 & (undefined1  [32])0x100000000) ==
                                        (undefined1  [32])0x0) && SUB321(auVar116 >> 0xbf,0) == '\0'
                                    ) && (auVar116 & (undefined1  [32])0x100000000) ==
                                         (undefined1  [32])0x0) && -1 < auVar116[0x1f];
                          auVar135 = vandps_avx(auVar135,local_2ce0);
                          auVar106 = ZEXT3264(auVar135);
                        }
                        uVar70 = uVar70 - 1 & uVar70;
                      } while ((uVar70 != 0) && (!bVar78));
                    }
                    lVar64 = local_2e58 + 1;
                  } while (lVar64 != local_2e60);
                  auVar135 = vpcmpeqd_avx2(auVar128._0_32_,auVar128._0_32_);
                  auVar104._0_4_ = auVar106._0_4_ ^ auVar135._0_4_;
                  auVar104._4_4_ = auVar106._4_4_ ^ auVar135._4_4_;
                  auVar104._8_4_ = auVar106._8_4_ ^ auVar135._8_4_;
                  auVar104._12_4_ = auVar106._12_4_ ^ auVar135._12_4_;
                  auVar104._16_4_ = auVar106._16_4_ ^ auVar135._16_4_;
                  auVar104._20_4_ = auVar106._20_4_ ^ auVar135._20_4_;
                  auVar104._24_4_ = auVar106._24_4_ ^ auVar135._24_4_;
                  auVar104._28_4_ = auVar106._28_4_ ^ auVar135._28_4_;
                }
                local_2e00 = vorps_avx(local_2e00,auVar104);
                auVar135 = auVar135 & ~local_2e00;
                if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar135 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar135 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar135 >> 0x7f,0) == '\0') &&
                      (auVar135 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar135 >> 0xbf,0) == '\0') &&
                    (auVar135 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar135[0x1f]) goto LAB_00554343;
                auVar126._8_4_ = 0xff800000;
                auVar126._0_8_ = 0xff800000ff800000;
                auVar126._12_4_ = 0xff800000;
                auVar126._16_4_ = 0xff800000;
                auVar126._20_4_ = 0xff800000;
                auVar126._24_4_ = 0xff800000;
                auVar126._28_4_ = 0xff800000;
                auVar128 = ZEXT3264(auVar126);
                auVar135 = vblendvps_avx(local_2b20,auVar126,local_2e00);
                auVar116 = vpcmpeqd_avx2(local_2b20,local_2b20);
                auVar106 = ZEXT3264(auVar116);
                local_2b20 = auVar135;
              }
              goto LAB_00552e1a;
            }
            uVar60 = root.ptr & 0xfffffffffffffff0;
            auVar135 = vcmpps_avx(local_2b20,auVar143._0_32_,6);
            auVar99._8_4_ = 0x7f800000;
            auVar99._0_8_ = 0x7f8000007f800000;
            auVar99._12_4_ = 0x7f800000;
            auVar99._16_4_ = 0x7f800000;
            auVar99._20_4_ = 0x7f800000;
            auVar99._24_4_ = 0x7f800000;
            auVar99._28_4_ = 0x7f800000;
            lVar64 = -0x10;
            root.ptr = 8;
            do {
              uVar70 = *(ulong *)(uVar60 + 0x20 + lVar64 * 2);
              if (uVar70 == 8) {
                auVar143 = ZEXT3264(auVar99);
                break;
              }
              uVar75 = *(undefined4 *)(uVar60 + 0x90 + lVar64);
              auVar136._4_4_ = uVar75;
              auVar136._0_4_ = uVar75;
              auVar136._8_4_ = uVar75;
              auVar136._12_4_ = uVar75;
              auVar136._16_4_ = uVar75;
              auVar136._20_4_ = uVar75;
              auVar136._24_4_ = uVar75;
              auVar136._28_4_ = uVar75;
              uVar75 = *(undefined4 *)(uVar60 + 0x30 + lVar64);
              auVar148._4_4_ = uVar75;
              auVar148._0_4_ = uVar75;
              auVar148._8_4_ = uVar75;
              auVar148._12_4_ = uVar75;
              auVar148._16_4_ = uVar75;
              auVar148._20_4_ = uVar75;
              auVar148._24_4_ = uVar75;
              auVar148._28_4_ = uVar75;
              auVar116 = *(undefined1 (*) [32])(ray + 0xe0);
              uVar75 = *(undefined4 *)(uVar60 + 0xb0 + lVar64);
              auVar162._4_4_ = uVar75;
              auVar162._0_4_ = uVar75;
              auVar162._8_4_ = uVar75;
              auVar162._12_4_ = uVar75;
              auVar162._16_4_ = uVar75;
              auVar162._20_4_ = uVar75;
              auVar162._24_4_ = uVar75;
              auVar162._28_4_ = uVar75;
              auVar80 = vfmadd231ps_fma(auVar148,auVar116,auVar136);
              uVar75 = *(undefined4 *)(uVar60 + 0x50 + lVar64);
              auVar137._4_4_ = uVar75;
              auVar137._0_4_ = uVar75;
              auVar137._8_4_ = uVar75;
              auVar137._12_4_ = uVar75;
              auVar137._16_4_ = uVar75;
              auVar137._20_4_ = uVar75;
              auVar137._24_4_ = uVar75;
              auVar137._28_4_ = uVar75;
              auVar95 = vfmadd231ps_fma(auVar137,auVar116,auVar162);
              uVar75 = *(undefined4 *)(uVar60 + 0xd0 + lVar64);
              auVar163._4_4_ = uVar75;
              auVar163._0_4_ = uVar75;
              auVar163._8_4_ = uVar75;
              auVar163._12_4_ = uVar75;
              auVar163._16_4_ = uVar75;
              auVar163._20_4_ = uVar75;
              auVar163._24_4_ = uVar75;
              auVar163._28_4_ = uVar75;
              uVar75 = *(undefined4 *)(uVar60 + 0x70 + lVar64);
              auVar177._4_4_ = uVar75;
              auVar177._0_4_ = uVar75;
              auVar177._8_4_ = uVar75;
              auVar177._12_4_ = uVar75;
              auVar177._16_4_ = uVar75;
              auVar177._20_4_ = uVar75;
              auVar177._24_4_ = uVar75;
              auVar177._28_4_ = uVar75;
              uVar75 = *(undefined4 *)(uVar60 + 0xa0 + lVar64);
              auVar187._4_4_ = uVar75;
              auVar187._0_4_ = uVar75;
              auVar187._8_4_ = uVar75;
              auVar187._12_4_ = uVar75;
              auVar187._16_4_ = uVar75;
              auVar187._20_4_ = uVar75;
              auVar187._24_4_ = uVar75;
              auVar187._28_4_ = uVar75;
              uVar75 = *(undefined4 *)(uVar60 + 0x40 + lVar64);
              auVar196._4_4_ = uVar75;
              auVar196._0_4_ = uVar75;
              auVar196._8_4_ = uVar75;
              auVar196._12_4_ = uVar75;
              auVar196._16_4_ = uVar75;
              auVar196._20_4_ = uVar75;
              auVar196._24_4_ = uVar75;
              auVar196._28_4_ = uVar75;
              auVar81 = vfmadd231ps_fma(auVar177,auVar116,auVar163);
              auVar82 = vfmadd231ps_fma(auVar196,auVar116,auVar187);
              uVar75 = *(undefined4 *)(uVar60 + 0xc0 + lVar64);
              auVar164._4_4_ = uVar75;
              auVar164._0_4_ = uVar75;
              auVar164._8_4_ = uVar75;
              auVar164._12_4_ = uVar75;
              auVar164._16_4_ = uVar75;
              auVar164._20_4_ = uVar75;
              auVar164._24_4_ = uVar75;
              auVar164._28_4_ = uVar75;
              uVar75 = *(undefined4 *)(uVar60 + 0x60 + lVar64);
              auVar188._4_4_ = uVar75;
              auVar188._0_4_ = uVar75;
              auVar188._8_4_ = uVar75;
              auVar188._12_4_ = uVar75;
              auVar188._16_4_ = uVar75;
              auVar188._20_4_ = uVar75;
              auVar188._24_4_ = uVar75;
              auVar188._28_4_ = uVar75;
              uVar75 = *(undefined4 *)(uVar60 + 0xe0 + lVar64);
              auVar209._4_4_ = uVar75;
              auVar209._0_4_ = uVar75;
              auVar209._8_4_ = uVar75;
              auVar209._12_4_ = uVar75;
              auVar209._16_4_ = uVar75;
              auVar209._20_4_ = uVar75;
              auVar209._24_4_ = uVar75;
              auVar209._28_4_ = uVar75;
              auVar96 = vfmadd231ps_fma(auVar188,auVar116,auVar164);
              uVar75 = *(undefined4 *)(uVar60 + 0x80 + lVar64);
              auVar165._4_4_ = uVar75;
              auVar165._0_4_ = uVar75;
              auVar165._8_4_ = uVar75;
              auVar165._12_4_ = uVar75;
              auVar165._16_4_ = uVar75;
              auVar165._20_4_ = uVar75;
              auVar165._24_4_ = uVar75;
              auVar165._28_4_ = uVar75;
              auVar97 = vfmadd231ps_fma(auVar165,auVar116,auVar209);
              auVar52._8_8_ = local_2cc0._8_8_;
              auVar52._0_8_ = local_2cc0._0_8_;
              auVar52._16_8_ = local_2cc0._16_8_;
              auVar52._24_8_ = local_2cc0._24_8_;
              auVar54._8_8_ = local_2cc0._40_8_;
              auVar54._0_8_ = local_2cc0._32_8_;
              auVar54._16_8_ = local_2cc0._48_8_;
              auVar54._24_8_ = local_2cc0._56_8_;
              auVar56._8_8_ = local_2cc0._72_8_;
              auVar56._0_8_ = local_2cc0._64_8_;
              auVar56._16_8_ = local_2cc0._80_8_;
              auVar56._24_8_ = local_2cc0._88_8_;
              auVar85 = vsubps_avx(ZEXT1632(auVar80),auVar52);
              auVar23._4_4_ = local_2c00._4_4_ * auVar85._4_4_;
              auVar23._0_4_ = local_2c00._0_4_ * auVar85._0_4_;
              auVar23._8_4_ = local_2c00._8_4_ * auVar85._8_4_;
              auVar23._12_4_ = local_2c00._12_4_ * auVar85._12_4_;
              auVar23._16_4_ = local_2c00._16_4_ * auVar85._16_4_;
              auVar23._20_4_ = local_2c00._20_4_ * auVar85._20_4_;
              auVar23._24_4_ = local_2c00._24_4_ * auVar85._24_4_;
              auVar23._28_4_ = auVar85._28_4_;
              auVar85 = vsubps_avx(ZEXT1632(auVar95),auVar54);
              in_ZMM13 = ZEXT3264(_local_2be0);
              auVar106._0_4_ = local_2be0._0_4_ * auVar85._0_4_;
              auVar106._4_4_ = local_2be0._4_4_ * auVar85._4_4_;
              auVar106._8_4_ = local_2be0._8_4_ * auVar85._8_4_;
              auVar106._12_4_ = local_2be0._12_4_ * auVar85._12_4_;
              auVar106._16_4_ = local_2be0._16_4_ * auVar85._16_4_;
              auVar106._20_4_ = local_2be0._20_4_ * auVar85._20_4_;
              auVar106._28_36_ = in_ZMM14._28_36_;
              auVar106._24_4_ = local_2be0._24_4_ * auVar85._24_4_;
              auVar134 = auVar106._0_32_;
              in_ZMM14 = ZEXT3264(auVar134);
              auVar85 = vsubps_avx(ZEXT1632(auVar81),auVar56);
              auVar128._0_4_ = auVar85._0_4_ * (float)local_2bc0._0_4_;
              auVar128._4_4_ = auVar85._4_4_ * (float)local_2bc0._4_4_;
              auVar128._8_4_ = auVar85._8_4_ * fStack_2bb8;
              auVar128._12_4_ = auVar85._12_4_ * fStack_2bb4;
              auVar128._16_4_ = auVar85._16_4_ * fStack_2bb0;
              auVar128._20_4_ = auVar85._20_4_ * fStack_2bac;
              auVar128._28_36_ = in_ZMM15._28_36_;
              auVar128._24_4_ = auVar85._24_4_ * fStack_2ba8;
              auVar147 = auVar128._0_32_;
              in_ZMM15 = ZEXT3264(auVar147);
              auVar85 = vsubps_avx(ZEXT1632(auVar82),auVar52);
              auVar197._0_4_ = local_2c00._0_4_ * auVar85._0_4_;
              auVar197._4_4_ = local_2c00._4_4_ * auVar85._4_4_;
              auVar197._8_4_ = local_2c00._8_4_ * auVar85._8_4_;
              auVar197._12_4_ = local_2c00._12_4_ * auVar85._12_4_;
              auVar197._16_4_ = local_2c00._16_4_ * auVar85._16_4_;
              auVar197._20_4_ = local_2c00._20_4_ * auVar85._20_4_;
              auVar197._24_4_ = local_2c00._24_4_ * auVar85._24_4_;
              auVar197._28_4_ = 0;
              auVar85 = vsubps_avx(ZEXT1632(auVar96),auVar54);
              auVar189._0_4_ = local_2be0._0_4_ * auVar85._0_4_;
              auVar189._4_4_ = local_2be0._4_4_ * auVar85._4_4_;
              auVar189._8_4_ = local_2be0._8_4_ * auVar85._8_4_;
              auVar189._12_4_ = local_2be0._12_4_ * auVar85._12_4_;
              auVar189._16_4_ = local_2be0._16_4_ * auVar85._16_4_;
              auVar189._20_4_ = local_2be0._20_4_ * auVar85._20_4_;
              auVar189._24_4_ = local_2be0._24_4_ * auVar85._24_4_;
              auVar189._28_4_ = 0;
              auVar85 = vsubps_avx(ZEXT1632(auVar97),auVar56);
              auVar166._0_4_ = auVar85._0_4_ * (float)local_2bc0._0_4_;
              auVar166._4_4_ = auVar85._4_4_ * (float)local_2bc0._4_4_;
              auVar166._8_4_ = auVar85._8_4_ * fStack_2bb8;
              auVar166._12_4_ = auVar85._12_4_ * fStack_2bb4;
              auVar166._16_4_ = auVar85._16_4_ * fStack_2bb0;
              auVar166._20_4_ = auVar85._20_4_ * fStack_2bac;
              auVar166._24_4_ = auVar85._24_4_ * fStack_2ba8;
              auVar166._28_4_ = 0;
              auVar85 = vpminsd_avx2(auVar23,auVar197);
              auVar133 = vpminsd_avx2(auVar134,auVar189);
              auVar85 = vpmaxsd_avx2(auVar85,auVar133);
              auVar133 = vpminsd_avx2(auVar147,auVar166);
              auVar85 = vpmaxsd_avx2(auVar85,auVar133);
              auVar24._4_4_ = auVar85._4_4_ * 0.99999964;
              auVar24._0_4_ = auVar85._0_4_ * 0.99999964;
              auVar24._8_4_ = auVar85._8_4_ * 0.99999964;
              auVar24._12_4_ = auVar85._12_4_ * 0.99999964;
              auVar24._16_4_ = auVar85._16_4_ * 0.99999964;
              auVar24._20_4_ = auVar85._20_4_ * 0.99999964;
              auVar24._24_4_ = auVar85._24_4_ * 0.99999964;
              auVar24._28_4_ = auVar85._28_4_;
              auVar85 = vpmaxsd_avx2(auVar23,auVar197);
              auVar133 = vpmaxsd_avx2(auVar134,auVar189);
              auVar133 = vpminsd_avx2(auVar85,auVar133);
              auVar85 = vpmaxsd_avx2(auVar147,auVar166);
              auVar85 = vpminsd_avx2(auVar133,auVar85);
              auVar25._4_4_ = auVar85._4_4_ * 1.0000004;
              auVar25._0_4_ = auVar85._0_4_ * 1.0000004;
              auVar25._8_4_ = auVar85._8_4_ * 1.0000004;
              auVar25._12_4_ = auVar85._12_4_ * 1.0000004;
              auVar25._16_4_ = auVar85._16_4_ * 1.0000004;
              auVar25._20_4_ = auVar85._20_4_ * 1.0000004;
              auVar25._24_4_ = auVar85._24_4_ * 1.0000004;
              auVar25._28_4_ = auVar85._28_4_;
              auVar85 = vpmaxsd_avx2(auVar24,local_2b40);
              auVar133 = vpminsd_avx2(auVar25,local_2b20);
              auVar85 = vcmpps_avx(auVar85,auVar133,2);
              if ((uVar62 & 7) == 6) {
                uVar75 = *(undefined4 *)(uVar60 + 0xf0 + lVar64);
                auVar167._4_4_ = uVar75;
                auVar167._0_4_ = uVar75;
                auVar167._8_4_ = uVar75;
                auVar167._12_4_ = uVar75;
                auVar167._16_4_ = uVar75;
                auVar167._20_4_ = uVar75;
                auVar167._24_4_ = uVar75;
                auVar167._28_4_ = uVar75;
                auVar133 = vcmpps_avx(auVar167,auVar116,2);
                uVar75 = *(undefined4 *)(uVar60 + 0x100 + lVar64);
                auVar178._4_4_ = uVar75;
                auVar178._0_4_ = uVar75;
                auVar178._8_4_ = uVar75;
                auVar178._12_4_ = uVar75;
                auVar178._16_4_ = uVar75;
                auVar178._20_4_ = uVar75;
                auVar178._24_4_ = uVar75;
                auVar178._28_4_ = uVar75;
                auVar116 = vcmpps_avx(auVar116,auVar178,1);
                auVar116 = vandps_avx(auVar133,auVar116);
                auVar116 = vandps_avx(auVar116,auVar85);
                auVar80 = vpackssdw_avx(auVar116._0_16_,auVar116._16_16_);
              }
              else {
                auVar80 = vpackssdw_avx(auVar85._0_16_,auVar85._16_16_);
              }
              auVar95 = vpackssdw_avx(auVar135._0_16_,auVar135._16_16_);
              auVar80 = vpand_avx(auVar80,auVar95);
              auVar116 = vpmovzxwd_avx2(auVar80);
              auVar116 = vpslld_avx2(auVar116,0x1f);
              auVar128 = ZEXT3264(auVar116);
              if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar116 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar116 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar116 >> 0x7f,0) == '\0') &&
                    (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar116 >> 0xbf,0) == '\0') &&
                  (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar116[0x1f]) {
                auVar143 = ZEXT3264(auVar99);
                uVar70 = root.ptr;
              }
              else {
                auVar149._8_4_ = 0x7f800000;
                auVar149._0_8_ = 0x7f8000007f800000;
                auVar149._12_4_ = 0x7f800000;
                auVar149._16_4_ = 0x7f800000;
                auVar149._20_4_ = 0x7f800000;
                auVar149._24_4_ = 0x7f800000;
                auVar149._28_4_ = 0x7f800000;
                auVar116 = vblendvps_avx(auVar149,auVar24,auVar116);
                auVar143 = ZEXT3264(auVar116);
                if (root.ptr != 8) {
                  *puVar72 = root.ptr;
                  puVar72 = puVar72 + 1;
                  *pauVar73 = auVar99;
                  pauVar73 = pauVar73 + 1;
                }
              }
              root.ptr = uVar70;
              auVar99 = auVar143._0_32_;
              lVar64 = lVar64 + 4;
            } while (lVar64 != 0);
            if (root.ptr == 8) {
              iVar59 = 4;
              auVar135 = vpcmpeqd_avx2(auVar99,auVar99);
              auVar106 = ZEXT3264(auVar135);
              goto LAB_00554214;
            }
            auVar135 = vcmpps_avx(local_2b20,auVar143._0_32_,6);
            uVar75 = vmovmskps_avx(auVar135);
            auVar135 = vpcmpeqd_avx2(auVar99,auVar99);
            auVar106 = ZEXT3264(auVar135);
          } while ((byte)local_2f30 < (byte)POPCOUNT(uVar75));
          *puVar72 = root.ptr;
          puVar72 = puVar72 + 1;
          *pauVar73 = auVar143._0_32_;
          pauVar73 = pauVar73 + 1;
          iVar59 = 4;
        }
        else {
          while (local_2d40 = auVar135, unaff_R14 != 0) {
            local_2f38 = 0;
            for (uVar60 = unaff_R14; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
              local_2f38 = local_2f38 + 1;
            }
            auVar135 = ZEXT1632(auVar106._0_16_);
            auVar128 = ZEXT1664(auVar128._0_16_);
            in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
            in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
            in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
            local_2f28 = pauVar73;
            local_2f20 = puVar72;
            bVar78 = occluded1(local_2e68,local_2e70,root,local_2f38,&local_2f3a,ray,
                               (TravRayK<8,_true> *)&local_2cc0.field_0,context);
            if (bVar78) {
              *(undefined4 *)(local_2e00 + local_2f38 * 4) = 0xffffffff;
            }
            unaff_R14 = unaff_R14 - 1 & unaff_R14;
            auVar135 = vpcmpeqd_avx2(auVar135,auVar135);
            auVar106 = ZEXT3264(auVar135);
            auVar143 = ZEXT3264(local_2d40);
            puVar72 = local_2f20;
            pauVar73 = local_2f28;
            auVar135 = local_2d40;
            auVar116 = local_2d40;
          }
          auVar135 = auVar106._0_32_ & ~local_2e00;
          iVar59 = 3;
          if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar135 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar135 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar135 >> 0x7f,0) != '\0') ||
                (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar135 >> 0xbf,0) != '\0') ||
              (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar135[0x1f] < '\0') {
            auVar127._8_4_ = 0xff800000;
            auVar127._0_8_ = 0xff800000ff800000;
            auVar127._12_4_ = 0xff800000;
            auVar127._16_4_ = 0xff800000;
            auVar127._20_4_ = 0xff800000;
            auVar127._24_4_ = 0xff800000;
            auVar127._28_4_ = 0xff800000;
            auVar128 = ZEXT3264(auVar127);
            auVar135 = vblendvps_avx(local_2b20,auVar127,local_2e00);
            auVar85 = vpcmpeqd_avx2(local_2b20,local_2b20);
            auVar106 = ZEXT3264(auVar85);
            iVar59 = 2;
            local_2b20 = auVar135;
          }
          unaff_R14 = 0;
          local_2d40 = auVar116;
          if ((uint)local_2f30 < (uint)POPCOUNT(uVar75)) goto LAB_00552e5a;
        }
LAB_00554214:
      } while (iVar59 != 3);
LAB_00554343:
      auVar135 = vandps_avx(local_2880,local_2e00);
      auVar105._8_4_ = 0xff800000;
      auVar105._0_8_ = 0xff800000ff800000;
      auVar105._12_4_ = 0xff800000;
      auVar105._16_4_ = 0xff800000;
      auVar105._20_4_ = 0xff800000;
      auVar105._24_4_ = 0xff800000;
      auVar105._28_4_ = 0xff800000;
      auVar135 = vmaskmovps_avx(auVar135,auVar105);
      *(undefined1 (*) [32])local_2f08 = auVar135;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }